

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx::ArrayIntersectorK_1<8,_embree::avx::QuadMvIntersectorKMoeller<4,_8,_false>_>,_true>
     ::intersectCoherent(vint<8> *valid_i,Intersectors *This,RayHitK<8> *ray,
                        RayQueryContext *context)

{
  RayHitK<8> *pRVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong *puVar4;
  float *pfVar5;
  undefined4 uVar6;
  AccelData *pAVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  float fVar27;
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  float fVar37;
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  float fVar46;
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  uint uVar73;
  undefined8 uVar74;
  undefined8 uVar75;
  undefined8 uVar76;
  undefined8 uVar77;
  ulong *puVar78;
  ulong uVar79;
  long lVar80;
  long lVar81;
  ulong uVar82;
  uint uVar83;
  ulong uVar84;
  ulong uVar85;
  long lVar86;
  ulong uVar87;
  ulong uVar88;
  ulong uVar89;
  ulong uVar90;
  size_t i;
  long lVar91;
  ulong uVar92;
  undefined1 auVar93 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  float fVar121;
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  float fVar117;
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  float fVar115;
  float fVar116;
  float fVar118;
  float fVar119;
  float fVar120;
  undefined1 in_ZMM0 [64];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  float fVar127;
  float fVar129;
  float fVar130;
  undefined1 auVar128 [32];
  undefined1 auVar132 [16];
  float fVar139;
  float fVar140;
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar141 [36];
  undefined1 auVar142 [16];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  float fVar145;
  float fVar147;
  float fVar148;
  uint uVar149;
  float fVar150;
  uint uVar151;
  float fVar152;
  uint uVar153;
  float fVar154;
  uint uVar155;
  float fVar156;
  uint uVar157;
  undefined1 auVar146 [32];
  uint uVar158;
  undefined1 auVar159 [16];
  undefined1 auVar160 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar167 [16];
  float fVar166;
  float fVar172;
  float fVar173;
  float fVar176;
  float fVar178;
  float fVar180;
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  float fVar174;
  float fVar175;
  float fVar177;
  float fVar179;
  float fVar181;
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar186 [32];
  undefined1 auVar184 [32];
  undefined1 auVar187 [64];
  float fVar188;
  float fVar197;
  float fVar198;
  vint4 bi;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  float fVar200;
  float fVar201;
  float fVar202;
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  float fVar199;
  undefined1 auVar196 [32];
  float fVar203;
  float fVar214;
  float fVar215;
  vint4 bi_1;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  float fVar216;
  undefined1 auVar211 [32];
  float fVar217;
  float fVar218;
  float fVar219;
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar212 [64];
  float fVar220;
  float fVar225;
  float fVar226;
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  float fVar227;
  float fVar228;
  float fVar229;
  float fVar230;
  undefined1 auVar231 [16];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [16];
  uint uVar236;
  undefined1 auVar235 [32];
  uint uVar237;
  vfloat<4> fmin;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  ulong local_15c0;
  ulong uStack_15b8;
  undefined1 local_15a0 [8];
  float fStack_1598;
  float fStack_1594;
  float fStack_1590;
  float fStack_158c;
  float fStack_1588;
  float fStack_1584;
  undefined1 local_1580 [8];
  float fStack_1578;
  float fStack_1574;
  float fStack_1570;
  float fStack_156c;
  float fStack_1568;
  float fStack_1564;
  undefined1 local_1510 [16];
  undefined1 local_1500 [32];
  undefined1 local_14e0 [16];
  undefined1 auStack_14d0 [16];
  undefined1 local_14a0 [8];
  float fStack_1498;
  float fStack_1494;
  float fStack_1490;
  float fStack_148c;
  float fStack_1488;
  float fStack_1484;
  undefined1 local_1440 [32];
  undefined1 local_1400 [8];
  float fStack_13f8;
  float fStack_13f4;
  undefined8 uStack_13f0;
  float fStack_13e8;
  undefined1 local_13e0 [8];
  float fStack_13d8;
  float fStack_13d4;
  float fStack_13d0;
  float fStack_13cc;
  float fStack_13c8;
  float fStack_13c4;
  undefined1 local_1360 [32];
  undefined1 local_1340 [16];
  undefined1 local_1330 [16];
  undefined1 local_1320 [16];
  undefined1 local_1310 [16];
  undefined1 local_1300 [8];
  float fStack_12f8;
  float fStack_12f4;
  undefined1 local_12f0 [8];
  float fStack_12e8;
  float fStack_12e4;
  undefined1 local_12e0 [8];
  float fStack_12d8;
  float fStack_12d4;
  undefined1 local_12d0 [16];
  undefined1 local_12c0 [8];
  float fStack_12b8;
  float fStack_12b4;
  undefined1 local_12b0 [16];
  undefined1 local_12a0 [8];
  float fStack_1298;
  float fStack_1294;
  undefined1 local_1290 [16];
  undefined1 local_1280 [8];
  float fStack_1278;
  float fStack_1274;
  undefined1 local_1270 [16];
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  undefined1 local_1200 [32];
  undefined1 local_11e0 [32];
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined1 local_11a0 [32];
  float local_1180;
  float fStack_117c;
  float fStack_1178;
  float fStack_1174;
  float fStack_1170;
  float fStack_116c;
  float fStack_1168;
  undefined4 uStack_1164;
  float local_1160;
  float fStack_115c;
  float fStack_1158;
  float fStack_1154;
  float fStack_1150;
  float fStack_114c;
  float fStack_1148;
  float fStack_1144;
  float local_1140;
  float fStack_113c;
  float fStack_1138;
  float fStack_1134;
  float fStack_1130;
  float fStack_112c;
  float fStack_1128;
  float fStack_1124;
  float local_1120;
  float fStack_111c;
  float fStack_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  float fStack_1108;
  float fStack_1104;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined1 local_1060 [32];
  undefined1 local_1040 [32];
  undefined1 local_1020 [32];
  float local_1000;
  float fStack_ffc;
  float fStack_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float fStack_fe8;
  float fStack_fe4;
  float local_fe0;
  float fStack_fdc;
  float fStack_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float fStack_fc8;
  float fStack_fc4;
  undefined1 local_fc0 [32];
  ulong local_fa0;
  undefined4 local_f98 [2];
  ulong local_f90 [492];
  undefined1 auVar131 [36];
  undefined1 auVar161 [32];
  undefined1 auVar185 [32];
  undefined1 auVar213 [64];
  undefined1 auVar224 [64];
  undefined1 auVar223 [64];
  
  uVar77 = mm_lookupmask_pd._8_8_;
  uVar76 = mm_lookupmask_pd._0_8_;
  uVar75 = mm_lookupmask_ps._24_8_;
  uVar74 = mm_lookupmask_ps._16_8_;
  auVar93 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
  auVar132 = vpcmpeqd_avx(auVar93,*(undefined1 (*) [16])(valid_i->field_0).field_1.vl);
  auVar93 = vpcmpeqd_avx(auVar93,*(undefined1 (*) [16])((long)&valid_i->field_0 + 0x10));
  auVar93 = vpackssdw_avx(auVar132,auVar93);
  if ((((((((((((((((auVar93 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar93 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar93 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar93 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar93 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar93 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar93 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar93 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar93 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar93 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar93 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar93 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar93 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
       (auVar93 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar93 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar93[0xf]) {
    return;
  }
  auVar132 = vpacksswb_avx(auVar93,auVar93);
  pAVar7 = This->ptr;
  uVar82 = (ulong)(byte)(SUB161(auVar132 >> 7,0) & 1 | (SUB161(auVar132 >> 0xf,0) & 1) << 1 |
                         (SUB161(auVar132 >> 0x17,0) & 1) << 2 |
                         (SUB161(auVar132 >> 0x1f,0) & 1) << 3 |
                         (SUB161(auVar132 >> 0x27,0) & 1) << 4 |
                         (SUB161(auVar132 >> 0x2f,0) & 1) << 5 |
                         (SUB161(auVar132 >> 0x37,0) & 1) << 6 | SUB161(auVar132 >> 0x3f,0) << 7);
  auVar70 = *(undefined1 (*) [32])ray;
  auVar67 = *(undefined1 (*) [32])ray;
  local_10c0 = *(undefined8 *)ray;
  uStack_10b8 = *(undefined8 *)(ray + 8);
  uStack_10b0 = *(undefined8 *)(ray + 0x10);
  uStack_10a8 = *(undefined8 *)(ray + 0x18);
  pRVar1 = ray + 0x20;
  auVar71 = *(undefined1 (*) [32])pRVar1;
  auVar68 = *(undefined1 (*) [32])pRVar1;
  local_10e0 = *(undefined8 *)pRVar1;
  uStack_10d8 = *(undefined8 *)(ray + 0x28);
  uStack_10d0 = *(undefined8 *)(ray + 0x30);
  uStack_10c8 = *(undefined8 *)(ray + 0x38);
  pRVar1 = ray + 0x40;
  auVar72 = *(undefined1 (*) [32])pRVar1;
  auVar69 = *(undefined1 (*) [32])pRVar1;
  local_1100 = *(undefined8 *)pRVar1;
  uStack_10f8 = *(undefined8 *)(ray + 0x48);
  uStack_10f0 = *(undefined8 *)(ray + 0x50);
  uStack_10e8 = *(undefined8 *)(ray + 0x58);
  auVar185 = *(undefined1 (*) [32])(ray + 0x80);
  auVar95._8_4_ = 0x7fffffff;
  auVar95._0_8_ = 0x7fffffff7fffffff;
  auVar95._12_4_ = 0x7fffffff;
  auVar95._16_4_ = 0x7fffffff;
  auVar95._20_4_ = 0x7fffffff;
  auVar95._24_4_ = 0x7fffffff;
  auVar95._28_4_ = 0x7fffffff;
  auVar8 = vandps_avx(auVar185,auVar95);
  auVar160._8_4_ = 0x219392ef;
  auVar160._0_8_ = 0x219392ef219392ef;
  auVar160._12_4_ = 0x219392ef;
  auVar160._16_4_ = 0x219392ef;
  auVar160._20_4_ = 0x219392ef;
  auVar160._24_4_ = 0x219392ef;
  auVar160._28_4_ = 0x219392ef;
  auVar8 = vcmpps_avx(auVar8,auVar160,1);
  auVar184 = vblendvps_avx(auVar185,auVar160,auVar8);
  auVar8 = *(undefined1 (*) [32])(ray + 0xa0);
  auVar133 = vandps_avx(auVar8,auVar95);
  auVar133 = vcmpps_avx(auVar133,auVar160,1);
  auVar9 = vblendvps_avx(auVar8,auVar160,auVar133);
  auVar133 = *(undefined1 (*) [32])(ray + 0xc0);
  auVar95 = vandps_avx(auVar133,auVar95);
  auVar95 = vcmpps_avx(auVar95,auVar160,1);
  auVar95 = vblendvps_avx(auVar133,auVar160,auVar95);
  auVar160 = vrcpps_avx(auVar184);
  local_1120 = auVar160._0_4_;
  fStack_111c = auVar160._4_4_;
  auVar23._4_4_ = auVar184._4_4_ * fStack_111c;
  auVar23._0_4_ = auVar184._0_4_ * local_1120;
  fStack_1118 = auVar160._8_4_;
  auVar23._8_4_ = auVar184._8_4_ * fStack_1118;
  fStack_1114 = auVar160._12_4_;
  auVar23._12_4_ = auVar184._12_4_ * fStack_1114;
  fStack_1110 = auVar160._16_4_;
  auVar23._16_4_ = auVar184._16_4_ * fStack_1110;
  fStack_110c = auVar160._20_4_;
  auVar23._20_4_ = auVar184._20_4_ * fStack_110c;
  fStack_1108 = auVar160._24_4_;
  auVar23._24_4_ = auVar184._24_4_ * fStack_1108;
  auVar23._28_4_ = auVar184._28_4_;
  auVar94._8_4_ = 0x3f800000;
  auVar94._0_8_ = 0x3f8000003f800000;
  auVar94._12_4_ = 0x3f800000;
  auVar94._16_4_ = 0x3f800000;
  auVar94._20_4_ = 0x3f800000;
  auVar94._24_4_ = 0x3f800000;
  auVar94._28_4_ = 0x3f800000;
  auVar23 = vsubps_avx(auVar94,auVar23);
  auVar184 = vrcpps_avx(auVar9);
  local_1120 = local_1120 + local_1120 * auVar23._0_4_;
  fStack_111c = fStack_111c + fStack_111c * auVar23._4_4_;
  fStack_1118 = fStack_1118 + fStack_1118 * auVar23._8_4_;
  fStack_1114 = fStack_1114 + fStack_1114 * auVar23._12_4_;
  fStack_1110 = fStack_1110 + fStack_1110 * auVar23._16_4_;
  fStack_110c = fStack_110c + fStack_110c * auVar23._20_4_;
  fStack_1108 = fStack_1108 + fStack_1108 * auVar23._24_4_;
  fStack_1104 = auVar160._28_4_ + auVar23._28_4_;
  local_1140 = auVar184._0_4_;
  fStack_113c = auVar184._4_4_;
  auVar24._4_4_ = fStack_113c * auVar9._4_4_;
  auVar24._0_4_ = local_1140 * auVar9._0_4_;
  fStack_1138 = auVar184._8_4_;
  auVar24._8_4_ = fStack_1138 * auVar9._8_4_;
  fStack_1134 = auVar184._12_4_;
  auVar24._12_4_ = fStack_1134 * auVar9._12_4_;
  fStack_1130 = auVar184._16_4_;
  auVar24._16_4_ = fStack_1130 * auVar9._16_4_;
  fStack_112c = auVar184._20_4_;
  auVar24._20_4_ = fStack_112c * auVar9._20_4_;
  fStack_1128 = auVar184._24_4_;
  auVar24._24_4_ = fStack_1128 * auVar9._24_4_;
  auVar24._28_4_ = auVar160._28_4_;
  auVar9 = vsubps_avx(auVar94,auVar24);
  local_1140 = local_1140 + local_1140 * auVar9._0_4_;
  fStack_113c = fStack_113c + fStack_113c * auVar9._4_4_;
  fStack_1138 = fStack_1138 + fStack_1138 * auVar9._8_4_;
  fStack_1134 = fStack_1134 + fStack_1134 * auVar9._12_4_;
  fStack_1130 = fStack_1130 + fStack_1130 * auVar9._16_4_;
  fStack_112c = fStack_112c + fStack_112c * auVar9._20_4_;
  fStack_1128 = fStack_1128 + fStack_1128 * auVar9._24_4_;
  fStack_1124 = auVar184._28_4_ + auVar9._28_4_;
  auVar184 = vrcpps_avx(auVar95);
  local_1160 = auVar184._0_4_;
  fStack_115c = auVar184._4_4_;
  auVar9._4_4_ = auVar95._4_4_ * fStack_115c;
  auVar9._0_4_ = auVar95._0_4_ * local_1160;
  fStack_1158 = auVar184._8_4_;
  auVar9._8_4_ = auVar95._8_4_ * fStack_1158;
  fStack_1154 = auVar184._12_4_;
  auVar9._12_4_ = auVar95._12_4_ * fStack_1154;
  fStack_1150 = auVar184._16_4_;
  auVar9._16_4_ = auVar95._16_4_ * fStack_1150;
  fStack_114c = auVar184._20_4_;
  auVar9._20_4_ = auVar95._20_4_ * fStack_114c;
  fStack_1148 = auVar184._24_4_;
  auVar9._24_4_ = auVar95._24_4_ * fStack_1148;
  auVar9._28_4_ = auVar95._28_4_;
  auVar95 = vsubps_avx(auVar94,auVar9);
  local_1160 = auVar95._0_4_ * local_1160 + local_1160;
  fStack_115c = auVar95._4_4_ * fStack_115c + fStack_115c;
  fStack_1158 = auVar95._8_4_ * fStack_1158 + fStack_1158;
  fStack_1154 = auVar95._12_4_ * fStack_1154 + fStack_1154;
  fStack_1150 = auVar95._16_4_ * fStack_1150 + fStack_1150;
  fStack_114c = auVar95._20_4_ * fStack_114c + fStack_114c;
  fStack_1148 = auVar95._24_4_ * fStack_1148 + fStack_1148;
  fStack_1144 = auVar95._28_4_ + auVar184._28_4_;
  auVar95 = ZEXT1232(ZEXT412(0)) << 0x20;
  local_1060 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar95);
  pRVar1 = ray + 0x100;
  auVar185 = vcmpps_avx(auVar185,auVar95,1);
  auVar207._8_4_ = 1;
  auVar207._0_8_ = 0x100000001;
  auVar207._12_4_ = 1;
  auVar207._16_4_ = 1;
  auVar207._20_4_ = 1;
  auVar207._24_4_ = 1;
  auVar207._28_4_ = 1;
  auVar185 = vandps_avx(auVar207,auVar185);
  auVar95 = ZEXT1232(ZEXT412(0)) << 0x20;
  auVar8 = vcmpps_avx(auVar8,auVar95,1);
  auVar208._8_4_ = 2;
  auVar208._0_8_ = 0x200000002;
  auVar208._12_4_ = 2;
  auVar208._16_4_ = 2;
  auVar208._20_4_ = 2;
  auVar208._24_4_ = 2;
  auVar208._28_4_ = 2;
  auVar8 = vandps_avx(auVar8,auVar208);
  auVar8 = vorps_avx(auVar8,auVar185);
  auVar185 = vcmpps_avx(auVar133,auVar95,1);
  auVar184._8_4_ = 4;
  auVar184._0_8_ = 0x400000004;
  auVar184._12_4_ = 4;
  auVar184._16_4_ = 4;
  auVar184._20_4_ = 4;
  auVar184._24_4_ = 4;
  auVar184._28_4_ = 4;
  auVar185 = vandps_avx(auVar185,auVar184);
  auVar8 = vorps_avx(auVar185,auVar8);
  auVar132 = vpmovsxwd_avx(auVar93);
  auVar93 = vpunpckhwd_avx(auVar93,auVar93);
  auVar133._16_16_ = auVar93;
  auVar133._0_16_ = auVar132;
  auVar185 = vcmpps_avx(ZEXT1632(auVar132),ZEXT1632(auVar132),0xf);
  local_1360 = vblendvps_avx(auVar185,auVar8,auVar133);
  local_1260 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar95);
  local_1080 = mm_lookupmask_ps._16_8_;
  uStack_1078 = mm_lookupmask_ps._24_8_;
  uStack_1070 = mm_lookupmask_ps._16_8_;
  uStack_1068 = mm_lookupmask_ps._24_8_;
  local_10a0 = mm_lookupmask_pd._0_8_;
  uStack_1098 = mm_lookupmask_pd._8_8_;
  uStack_1090 = mm_lookupmask_pd._0_8_;
  uStack_1088 = mm_lookupmask_pd._8_8_;
LAB_00396095:
  lVar86 = 0;
  if (uVar82 != 0) {
    for (; (uVar82 >> lVar86 & 1) == 0; lVar86 = lVar86 + 1) {
    }
  }
  uVar6 = *(undefined4 *)(local_1360 + lVar86 * 4);
  auVar132._4_4_ = uVar6;
  auVar132._0_4_ = uVar6;
  auVar132._8_4_ = uVar6;
  auVar132._12_4_ = uVar6;
  auVar93 = vpcmpeqd_avx(auVar132,local_1360._0_16_);
  auVar132 = vpcmpeqd_avx(auVar132,local_1360._16_16_);
  auVar93 = vpackssdw_avx(auVar93,auVar132);
  auVar204 = vpmovsxwd_avx(auVar93);
  auVar205 = vpunpckhwd_avx(auVar93,auVar93);
  auVar134._16_16_ = auVar205;
  auVar134._0_16_ = auVar204;
  auVar22 = vpacksswb_avx(auVar93,auVar93);
  auVar159._8_4_ = 0xff800000;
  auVar159._0_8_ = 0xff800000ff800000;
  auVar159._12_4_ = 0xff800000;
  auVar161._16_4_ = 0xff800000;
  auVar161._0_16_ = auVar159;
  auVar161._20_4_ = 0xff800000;
  auVar161._24_4_ = 0xff800000;
  auVar161._28_4_ = 0xff800000;
  auVar8 = vblendvps_avx(auVar161,local_1260,auVar134);
  auVar163._8_4_ = 0x7f800000;
  auVar163._0_8_ = 0x7f8000007f800000;
  auVar163._12_4_ = 0x7f800000;
  auVar163._16_4_ = 0x7f800000;
  auVar163._20_4_ = 0x7f800000;
  auVar163._24_4_ = 0x7f800000;
  auVar163._28_4_ = 0x7f800000;
  auVar185 = vblendvps_avx(auVar163,auVar67,auVar134);
  auVar133 = vshufps_avx(auVar185,auVar185,0xb1);
  auVar185 = vminps_avx(auVar185,auVar133);
  auVar133 = vshufpd_avx(auVar185,auVar185,5);
  auVar185 = vminps_avx(auVar185,auVar133);
  auVar93 = vminps_avx(auVar185._0_16_,auVar185._16_16_);
  auVar185 = vblendvps_avx(auVar163,auVar68,auVar134);
  auVar133 = vshufps_avx(auVar185,auVar185,0xb1);
  auVar185 = vminps_avx(auVar185,auVar133);
  auVar133 = vshufpd_avx(auVar185,auVar185,5);
  auVar185 = vminps_avx(auVar185,auVar133);
  auVar132 = vminps_avx(auVar185._0_16_,auVar185._16_16_);
  auVar185 = vblendvps_avx(auVar163,auVar69,auVar134);
  auVar132 = vunpcklps_avx(auVar93,auVar132);
  auVar133 = vshufps_avx(auVar185,auVar185,0xb1);
  auVar185 = vminps_avx(auVar185,auVar133);
  auVar133 = vshufpd_avx(auVar185,auVar185,5);
  auVar185 = vminps_avx(auVar185,auVar133);
  auVar93 = vminps_avx(auVar185._0_16_,auVar185._16_16_);
  auVar189 = vinsertps_avx(auVar132,auVar93,0x28);
  auVar185 = vblendvps_avx(auVar161,auVar67,auVar134);
  auVar133 = vshufps_avx(auVar185,auVar185,0xb1);
  auVar185 = vmaxps_avx(auVar185,auVar133);
  auVar133 = vshufpd_avx(auVar185,auVar185,5);
  auVar185 = vmaxps_avx(auVar185,auVar133);
  auVar93 = vmaxps_avx(auVar185._0_16_,auVar185._16_16_);
  auVar185 = vblendvps_avx(auVar161,auVar68,auVar134);
  auVar133 = vshufps_avx(auVar185,auVar185,0xb1);
  auVar185 = vmaxps_avx(auVar185,auVar133);
  auVar133 = vshufpd_avx(auVar185,auVar185,5);
  auVar185 = vmaxps_avx(auVar185,auVar133);
  auVar132 = vmaxps_avx(auVar185._0_16_,auVar185._16_16_);
  auVar132 = vunpcklps_avx(auVar93,auVar132);
  auVar185 = vblendvps_avx(auVar161,auVar69,auVar134);
  auVar133 = vshufps_avx(auVar185,auVar185,0xb1);
  auVar185 = vmaxps_avx(auVar185,auVar133);
  auVar133 = vshufpd_avx(auVar185,auVar185,5);
  auVar185 = vmaxps_avx(auVar185,auVar133);
  auVar93 = vmaxps_avx(auVar185._0_16_,auVar185._16_16_);
  auVar190 = vinsertps_avx(auVar132,auVar93,0x28);
  auVar61._4_4_ = fStack_111c;
  auVar61._0_4_ = local_1120;
  auVar61._8_4_ = fStack_1118;
  auVar61._12_4_ = fStack_1114;
  auVar61._16_4_ = fStack_1110;
  auVar61._20_4_ = fStack_110c;
  auVar61._24_4_ = fStack_1108;
  auVar61._28_4_ = fStack_1104;
  auVar185 = vblendvps_avx(auVar163,auVar61,auVar134);
  auVar133 = vshufps_avx(auVar185,auVar185,0xb1);
  auVar185 = vminps_avx(auVar185,auVar133);
  auVar133 = vshufpd_avx(auVar185,auVar185,5);
  auVar185 = vminps_avx(auVar185,auVar133);
  auVar93 = vminps_avx(auVar185._0_16_,auVar185._16_16_);
  auVar26._4_4_ = fStack_113c;
  auVar26._0_4_ = local_1140;
  auVar26._8_4_ = fStack_1138;
  auVar26._12_4_ = fStack_1134;
  auVar26._16_4_ = fStack_1130;
  auVar26._20_4_ = fStack_112c;
  auVar26._24_4_ = fStack_1128;
  auVar26._28_4_ = fStack_1124;
  auVar185 = vblendvps_avx(auVar163,auVar26,auVar134);
  auVar133 = vshufps_avx(auVar185,auVar185,0xb1);
  auVar185 = vminps_avx(auVar185,auVar133);
  auVar133 = vshufpd_avx(auVar185,auVar185,5);
  auVar185 = vminps_avx(auVar185,auVar133);
  auVar132 = vminps_avx(auVar185._0_16_,auVar185._16_16_);
  auVar25._4_4_ = fStack_115c;
  auVar25._0_4_ = local_1160;
  auVar25._8_4_ = fStack_1158;
  auVar25._12_4_ = fStack_1154;
  auVar25._16_4_ = fStack_1150;
  auVar25._20_4_ = fStack_114c;
  auVar25._24_4_ = fStack_1148;
  auVar25._28_4_ = fStack_1144;
  auVar185 = vblendvps_avx(auVar163,auVar25,auVar134);
  auVar132 = vunpcklps_avx(auVar93,auVar132);
  auVar133 = vshufps_avx(auVar185,auVar185,0xb1);
  auVar185 = vminps_avx(auVar185,auVar133);
  auVar133 = vshufpd_avx(auVar185,auVar185,5);
  auVar185 = vminps_avx(auVar185,auVar133);
  auVar93 = vminps_avx(auVar185._0_16_,auVar185._16_16_);
  auVar142 = vinsertps_avx(auVar132,auVar93,0x28);
  auVar185 = vblendvps_avx(auVar161,auVar61,auVar134);
  auVar133 = vshufps_avx(auVar185,auVar185,0xb1);
  auVar185 = vmaxps_avx(auVar185,auVar133);
  auVar133 = vshufpd_avx(auVar185,auVar185,5);
  auVar185 = vmaxps_avx(auVar185,auVar133);
  auVar93 = vmaxps_avx(auVar185._0_16_,auVar185._16_16_);
  auVar185 = vblendvps_avx(auVar161,auVar26,auVar134);
  auVar133 = vshufps_avx(auVar185,auVar185,0xb1);
  auVar185 = vmaxps_avx(auVar185,auVar133);
  auVar133 = vshufpd_avx(auVar185,auVar185,5);
  auVar185 = vmaxps_avx(auVar185,auVar133);
  auVar132 = vmaxps_avx(auVar185._0_16_,auVar185._16_16_);
  auVar132 = vunpcklps_avx(auVar93,auVar132);
  auVar185 = vblendvps_avx(auVar161,auVar25,auVar134);
  auVar133 = vshufps_avx(auVar185,auVar185,0xb1);
  auVar185 = vmaxps_avx(auVar185,auVar133);
  auVar133 = vshufpd_avx(auVar185,auVar185,5);
  auVar185 = vmaxps_avx(auVar185,auVar133);
  auVar93 = vmaxps_avx(auVar185._0_16_,auVar185._16_16_);
  auVar182 = vinsertps_avx(auVar132,auVar93,0x28);
  local_fc0 = vblendvps_avx(auVar163,local_1060,auVar134);
  auVar185 = vshufps_avx(local_fc0,local_fc0,0xb1);
  auVar185 = vminps_avx(local_fc0,auVar185);
  auVar133 = vshufpd_avx(auVar185,auVar185,5);
  auVar133 = vminps_avx(auVar185,auVar133);
  auVar185 = vshufps_avx(auVar8,auVar8,0xb1);
  auVar185 = vmaxps_avx(auVar8,auVar185);
  auVar95 = vshufpd_avx(auVar185,auVar185,5);
  auVar185 = vmaxps_avx(auVar185,auVar95);
  auVar10 = vcmpps_avx(auVar142,_DAT_01f7aa10,5);
  auVar93 = vblendvps_avx(auVar182,auVar142,auVar10);
  auVar132 = vblendvps_avx(auVar189,auVar190,auVar10);
  auVar189 = vblendvps_avx(auVar190,auVar189,auVar10);
  auVar190 = vmovshdup_avx(auVar93);
  uVar92 = (ulong)(auVar190._0_4_ < 0.0) << 4 | 0x20;
  auVar190 = vshufpd_avx(auVar93,auVar93,1);
  local_1510 = vmaxps_avx(auVar185._0_16_,auVar185._16_16_);
  uVar87 = (ulong)(auVar190._0_4_ < 0.0) << 4 | 0x40;
  auVar190 = vminps_avx(auVar133._0_16_,auVar133._16_16_);
  auVar10 = vblendvps_avx(auVar142,auVar182,auVar10);
  auVar182._0_4_ = auVar132._0_4_ * auVar93._0_4_;
  auVar182._4_4_ = auVar132._4_4_ * auVar93._4_4_;
  auVar182._8_4_ = auVar132._8_4_ * auVar93._8_4_;
  auVar182._12_4_ = auVar132._12_4_ * auVar93._12_4_;
  auVar142._0_4_ = auVar10._0_4_ * auVar189._0_4_;
  auVar142._4_4_ = auVar10._4_4_ * auVar189._4_4_;
  auVar142._8_4_ = auVar10._8_4_ * auVar189._8_4_;
  auVar142._12_4_ = auVar10._12_4_ * auVar189._12_4_;
  uVar88 = (ulong)(auVar93._0_4_ < 0.0) * 0x10;
  local_fa0 = *(ulong *)&pAVar7[1].bounds.bounds0.lower.field_0;
  local_f98[0] = 0;
  _local_1280 = vshufps_avx(auVar93,auVar93,0);
  local_1290 = vshufps_avx(auVar182,auVar182,0);
  _local_12a0 = vshufps_avx(auVar93,auVar93,0x55);
  local_12b0 = vshufps_avx(auVar182,auVar182,0x55);
  _local_12c0 = vshufps_avx(auVar93,auVar93,0xaa);
  local_12d0 = vshufps_avx(auVar182,auVar182,0xaa);
  _local_12e0 = vshufps_avx(auVar10,auVar10,0);
  local_14e0 = vblendvps_avx(auVar159,local_1260._16_16_,auVar205);
  _local_12f0 = vshufps_avx(auVar10,auVar10,0x55);
  _local_1300 = vshufps_avx(auVar10,auVar10,0xaa);
  local_1310 = vshufps_avx(auVar142,auVar142,0);
  local_1320 = vshufps_avx(auVar142,auVar142,0x55);
  local_1330 = vshufps_avx(auVar142,auVar142,0xaa);
  local_1340 = vshufps_avx(auVar190,auVar190,0);
  auVar93 = vblendvps_avx(auVar159,local_1260._0_16_,auVar204);
  _local_15a0 = ZEXT1632(auVar93);
  puVar78 = local_f90;
  auVar93 = vshufps_avx(local_1510,local_1510,0);
  _local_1580 = auVar93;
LAB_00396560:
  while( true ) {
    uVar6 = (undefined4)puVar78[-1];
    auVar185._4_4_ = uVar6;
    auVar185._0_4_ = uVar6;
    auVar185._8_4_ = uVar6;
    auVar185._12_4_ = uVar6;
    auVar185._16_4_ = uVar6;
    auVar185._20_4_ = uVar6;
    auVar185._24_4_ = uVar6;
    auVar185._28_4_ = uVar6;
    auVar187 = ZEXT3264(auVar185);
    puVar78 = puVar78 + -2;
    auVar185 = vcmpps_avx(auVar185,auVar8,1);
    if ((((((((auVar185 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar185 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar185 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar185 >> 0x7f,0) == '\0') &&
          (auVar185 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar185 >> 0xbf,0) == '\0') &&
        (auVar185 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar185[0x1f])
    break;
    uVar89 = *puVar78;
    while( true ) {
      if ((uVar89 & 8) != 0) {
        auVar185 = vcmpps_avx(auVar8,auVar187._0_32_,6);
        if ((((((((auVar185 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar185 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar185 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar185 >> 0x7f,0) == '\0') &&
              (auVar185 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar185 >> 0xbf,0) == '\0') &&
            (auVar185 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar185[0x1f]) goto LAB_003974c6;
        uVar79 = (ulong)((uint)uVar89 & 0xf);
        if (uVar79 == 8) goto LAB_0039747d;
        lVar86 = (uVar89 & 0xfffffffffffffff0) + 0xc0;
        lVar81 = 0;
        goto LAB_0039696c;
      }
      pfVar5 = (float *)(uVar89 + 0x20 + uVar88);
      auVar93._0_4_ = (float)local_1280._0_4_ * *pfVar5;
      auVar93._4_4_ = (float)local_1280._4_4_ * pfVar5[1];
      auVar93._8_4_ = fStack_1278 * pfVar5[2];
      auVar93._12_4_ = fStack_1274 * pfVar5[3];
      pfVar5 = (float *)(uVar89 + 0x20 + uVar92);
      auVar189._0_4_ = (float)local_12a0._0_4_ * *pfVar5;
      auVar189._4_4_ = (float)local_12a0._4_4_ * pfVar5[1];
      auVar189._8_4_ = fStack_1298 * pfVar5[2];
      auVar189._12_4_ = fStack_1294 * pfVar5[3];
      auVar93 = vsubps_avx(auVar93,local_1290);
      auVar132 = vsubps_avx(auVar189,local_12b0);
      pfVar5 = (float *)(uVar89 + 0x20 + uVar87);
      auVar204._0_4_ = (float)local_12c0._0_4_ * *pfVar5;
      auVar204._4_4_ = (float)local_12c0._4_4_ * pfVar5[1];
      auVar204._8_4_ = fStack_12b8 * pfVar5[2];
      auVar204._12_4_ = fStack_12b4 * pfVar5[3];
      auVar93 = vpmaxsd_avx(auVar93,auVar132);
      auVar132 = vsubps_avx(auVar204,local_12d0);
      auVar132 = vpmaxsd_avx(auVar132,local_1340);
      local_1270 = vpmaxsd_avx(auVar93,auVar132);
      pfVar5 = (float *)(uVar89 + 0x20 + (uVar88 ^ 0x10));
      auVar190._0_4_ = (float)local_12e0._0_4_ * *pfVar5;
      auVar190._4_4_ = (float)local_12e0._4_4_ * pfVar5[1];
      auVar190._8_4_ = fStack_12d8 * pfVar5[2];
      auVar190._12_4_ = fStack_12d4 * pfVar5[3];
      pfVar5 = (float *)(uVar89 + 0x20 + (uVar92 ^ 0x10));
      auVar205._0_4_ = (float)local_12f0._0_4_ * *pfVar5;
      auVar205._4_4_ = (float)local_12f0._4_4_ * pfVar5[1];
      auVar205._8_4_ = fStack_12e8 * pfVar5[2];
      auVar205._12_4_ = fStack_12e4 * pfVar5[3];
      auVar93 = vsubps_avx(auVar190,local_1310);
      auVar132 = vsubps_avx(auVar205,local_1320);
      pfVar5 = (float *)(uVar89 + 0x20 + (uVar87 ^ 0x10));
      auVar221._0_4_ = (float)local_1300._0_4_ * *pfVar5;
      auVar221._4_4_ = (float)local_1300._4_4_ * pfVar5[1];
      auVar221._8_4_ = fStack_12f8 * pfVar5[2];
      auVar221._12_4_ = fStack_12f4 * pfVar5[3];
      auVar223 = ZEXT1664(auVar221);
      auVar93 = vpminsd_avx(auVar93,auVar132);
      auVar132 = vsubps_avx(auVar221,local_1330);
      auVar132 = vpminsd_avx(auVar132,_local_1580);
      auVar212 = ZEXT1664(auVar132);
      auVar93 = vpminsd_avx(auVar93,auVar132);
      auVar93 = vcmpps_avx(local_1270,auVar93,2);
      uVar83 = vmovmskps_avx(auVar93);
      if (uVar83 == 0) break;
      uVar85 = (ulong)(uVar83 & 0xff);
      auVar187 = ZEXT3264(CONCAT428(0x7f800000,
                                    CONCAT424(0x7f800000,
                                              CONCAT420(0x7f800000,
                                                        CONCAT416(0x7f800000,
                                                                  CONCAT412(0x7f800000,
                                                                            CONCAT48(0x7f800000,
                                                                                                                                                                          
                                                  0x7f8000007f800000)))))));
      uVar84 = 0;
      uVar79 = 8;
      do {
        lVar86 = 0;
        if (uVar85 != 0) {
          for (; (uVar85 >> lVar86 & 1) == 0; lVar86 = lVar86 + 1) {
          }
        }
        uVar6 = *(undefined4 *)(uVar89 + 0x20 + lVar86 * 4);
        auVar192._4_4_ = uVar6;
        auVar192._0_4_ = uVar6;
        auVar192._8_4_ = uVar6;
        auVar192._12_4_ = uVar6;
        auVar192._16_4_ = uVar6;
        auVar192._20_4_ = uVar6;
        auVar192._24_4_ = uVar6;
        auVar192._28_4_ = uVar6;
        auVar185 = vsubps_avx(auVar192,auVar70);
        auVar206._0_4_ = auVar185._0_4_ * local_1120;
        auVar206._4_4_ = auVar185._4_4_ * fStack_111c;
        auVar206._8_4_ = auVar185._8_4_ * fStack_1118;
        auVar206._12_4_ = auVar185._12_4_ * fStack_1114;
        auVar213._16_4_ = auVar185._16_4_ * fStack_1110;
        auVar213._0_16_ = auVar206;
        auVar213._20_4_ = auVar185._20_4_ * fStack_110c;
        auVar213._28_36_ = auVar212._28_36_;
        auVar213._24_4_ = auVar185._24_4_ * fStack_1108;
        auVar212 = ZEXT3264(auVar213._0_32_);
        uVar6 = *(undefined4 *)(uVar89 + 0x40 + lVar86 * 4);
        auVar193._4_4_ = uVar6;
        auVar193._0_4_ = uVar6;
        auVar193._8_4_ = uVar6;
        auVar193._12_4_ = uVar6;
        auVar193._16_4_ = uVar6;
        auVar193._20_4_ = uVar6;
        auVar193._24_4_ = uVar6;
        auVar193._28_4_ = uVar6;
        auVar185 = vsubps_avx(auVar193,auVar71);
        auVar222._0_4_ = auVar185._0_4_ * local_1140;
        auVar222._4_4_ = auVar185._4_4_ * fStack_113c;
        auVar222._8_4_ = auVar185._8_4_ * fStack_1138;
        auVar222._12_4_ = auVar185._12_4_ * fStack_1134;
        auVar224._16_4_ = auVar185._16_4_ * fStack_1130;
        auVar224._0_16_ = auVar222;
        auVar224._20_4_ = auVar185._20_4_ * fStack_112c;
        auVar224._28_36_ = auVar223._28_36_;
        auVar224._24_4_ = auVar185._24_4_ * fStack_1128;
        auVar223 = ZEXT3264(auVar224._0_32_);
        uVar6 = *(undefined4 *)(uVar89 + 0x60 + lVar86 * 4);
        auVar194._4_4_ = uVar6;
        auVar194._0_4_ = uVar6;
        auVar194._8_4_ = uVar6;
        auVar194._12_4_ = uVar6;
        auVar194._16_4_ = uVar6;
        auVar194._20_4_ = uVar6;
        auVar194._24_4_ = uVar6;
        auVar194._28_4_ = uVar6;
        auVar185 = vsubps_avx(auVar194,auVar72);
        auVar191._0_4_ = auVar185._0_4_ * local_1160;
        auVar191._4_4_ = auVar185._4_4_ * fStack_115c;
        auVar191._8_4_ = auVar185._8_4_ * fStack_1158;
        auVar191._12_4_ = auVar185._12_4_ * fStack_1154;
        auVar28._16_4_ = auVar185._16_4_ * fStack_1150;
        auVar28._0_16_ = auVar191;
        auVar28._20_4_ = auVar185._20_4_ * fStack_114c;
        auVar28._24_4_ = auVar185._24_4_ * fStack_1148;
        auVar28._28_4_ = auVar185._28_4_;
        uVar6 = *(undefined4 *)(uVar89 + 0x30 + lVar86 * 4);
        auVar232._4_4_ = uVar6;
        auVar232._0_4_ = uVar6;
        auVar232._8_4_ = uVar6;
        auVar232._12_4_ = uVar6;
        auVar232._16_4_ = uVar6;
        auVar232._20_4_ = uVar6;
        auVar232._24_4_ = uVar6;
        auVar232._28_4_ = uVar6;
        auVar185 = vsubps_avx(auVar232,auVar70);
        auVar231._0_4_ = auVar185._0_4_ * local_1120;
        auVar231._4_4_ = auVar185._4_4_ * fStack_111c;
        auVar231._8_4_ = auVar185._8_4_ * fStack_1118;
        auVar231._12_4_ = auVar185._12_4_ * fStack_1114;
        auVar29._16_4_ = auVar185._16_4_ * fStack_1110;
        auVar29._0_16_ = auVar231;
        auVar29._20_4_ = auVar185._20_4_ * fStack_110c;
        auVar29._24_4_ = auVar185._24_4_ * fStack_1108;
        auVar29._28_4_ = auVar185._28_4_;
        uVar6 = *(undefined4 *)(uVar89 + 0x50 + lVar86 * 4);
        auVar235._4_4_ = uVar6;
        auVar235._0_4_ = uVar6;
        auVar235._8_4_ = uVar6;
        auVar235._12_4_ = uVar6;
        auVar235._16_4_ = uVar6;
        auVar235._20_4_ = uVar6;
        auVar235._24_4_ = uVar6;
        auVar235._28_4_ = uVar6;
        auVar185 = vsubps_avx(auVar235,auVar71);
        auVar234._0_4_ = auVar185._0_4_ * local_1140;
        auVar234._4_4_ = auVar185._4_4_ * fStack_113c;
        auVar234._8_4_ = auVar185._8_4_ * fStack_1138;
        auVar234._12_4_ = auVar185._12_4_ * fStack_1134;
        auVar30._16_4_ = auVar185._16_4_ * fStack_1130;
        auVar30._0_16_ = auVar234;
        auVar30._20_4_ = auVar185._20_4_ * fStack_112c;
        auVar30._24_4_ = auVar185._24_4_ * fStack_1128;
        auVar30._28_4_ = auVar185._28_4_;
        uVar6 = *(undefined4 *)(uVar89 + 0x70 + lVar86 * 4);
        auVar168._4_4_ = uVar6;
        auVar168._0_4_ = uVar6;
        auVar168._8_4_ = uVar6;
        auVar168._12_4_ = uVar6;
        auVar168._16_4_ = uVar6;
        auVar168._20_4_ = uVar6;
        auVar168._24_4_ = uVar6;
        auVar168._28_4_ = uVar6;
        auVar185 = vsubps_avx(auVar168,auVar72);
        auVar167._0_4_ = auVar185._0_4_ * local_1160;
        auVar167._4_4_ = auVar185._4_4_ * fStack_115c;
        auVar167._8_4_ = auVar185._8_4_ * fStack_1158;
        auVar167._12_4_ = auVar185._12_4_ * fStack_1154;
        auVar31._16_4_ = auVar185._16_4_ * fStack_1150;
        auVar31._0_16_ = auVar167;
        auVar31._20_4_ = auVar185._20_4_ * fStack_114c;
        auVar31._24_4_ = auVar185._24_4_ * fStack_1148;
        auVar31._28_4_ = auVar185._28_4_;
        auVar93 = vpmaxsd_avx(auVar213._16_16_,auVar29._16_16_);
        auVar132 = vpmaxsd_avx(auVar206,auVar231);
        auVar189 = vpmaxsd_avx(auVar224._16_16_,auVar30._16_16_);
        auVar189 = vpminsd_avx(auVar93,auVar189);
        auVar93 = vpmaxsd_avx(auVar222,auVar234);
        auVar132 = vpminsd_avx(auVar132,auVar93);
        auVar93 = vpmaxsd_avx(auVar191,auVar167);
        auVar93 = vpminsd_avx(auVar93,_local_15a0);
        auVar10 = vpminsd_avx(auVar132,auVar93);
        auVar93 = vpmaxsd_avx(auVar28._16_16_,auVar31._16_16_);
        auVar93 = vpminsd_avx(auVar93,local_14e0);
        auVar190 = vpminsd_avx(auVar189,auVar93);
        auVar93 = vpminsd_avx(auVar206,auVar231);
        auVar132 = vpminsd_avx(auVar213._16_16_,auVar29._16_16_);
        auVar189 = vpminsd_avx(auVar222,auVar234);
        auVar93 = vpmaxsd_avx(auVar93,auVar189);
        auVar189 = vpminsd_avx(auVar224._16_16_,auVar30._16_16_);
        auVar132 = vpmaxsd_avx(auVar132,auVar189);
        auVar189 = vpminsd_avx(auVar28._16_16_,auVar31._16_16_);
        auVar142 = vpminsd_avx(auVar191,auVar167);
        auVar189 = vpmaxsd_avx(auVar189,local_fc0._16_16_);
        auVar132 = vpmaxsd_avx(auVar132,auVar189);
        auVar189 = vpmaxsd_avx(auVar142,local_fc0._0_16_);
        auVar93 = vpmaxsd_avx(auVar93,auVar189);
        auVar96._16_16_ = auVar132;
        auVar96._0_16_ = auVar93;
        auVar122._16_16_ = auVar190;
        auVar122._0_16_ = auVar10;
        auVar185 = vcmpps_avx(auVar96,auVar122,2);
        uVar90 = uVar79;
        if ((((((((auVar185 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar185 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar185 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar185 >> 0x7f,0) != '\0') ||
              (auVar185 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar185 >> 0xbf,0) != '\0') ||
            (auVar185 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar185[0x1f] < '\0') {
          uVar6 = *(undefined4 *)(local_1270 + lVar86 * 4);
          auVar183._4_4_ = uVar6;
          auVar183._0_4_ = uVar6;
          auVar183._8_4_ = uVar6;
          auVar183._12_4_ = uVar6;
          auVar195._16_4_ = uVar6;
          auVar195._0_16_ = auVar183;
          auVar195._20_4_ = uVar6;
          auVar195._24_4_ = uVar6;
          auVar195._28_4_ = uVar6;
          uVar90 = *(ulong *)(uVar89 + lVar86 * 8);
          auVar185 = vcmpps_avx(auVar195,auVar187._0_32_,1);
          if ((((((((auVar185 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar185 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar185 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar185 >> 0x7f,0) == '\0') &&
                (auVar185 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar185 >> 0xbf,0) == '\0') &&
              (auVar185 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar185[0x1f]) {
            *puVar78 = uVar90;
            uVar90 = uVar79;
          }
          else {
            if (uVar79 == 8) {
              auVar187 = ZEXT3264(auVar195);
              goto LAB_0039682a;
            }
            *puVar78 = uVar79;
            auVar183 = auVar187._0_16_;
            auVar187 = ZEXT3264(auVar195);
          }
          auVar212 = ZEXT1664(auVar183);
          uVar84 = uVar84 + 1;
          *(int *)(puVar78 + 1) = auVar183._0_4_;
          puVar78 = puVar78 + 2;
        }
LAB_0039682a:
        uVar85 = uVar85 & uVar85 - 1;
        uVar79 = uVar90;
      } while (uVar85 != 0);
      if (uVar90 == 8) break;
      uVar89 = uVar90;
      if (1 < uVar84) {
        puVar2 = puVar78 + -4;
        puVar3 = puVar78 + -2;
        if ((uint)puVar78[-3] < (uint)puVar78[-1]) {
          local_15c0 = *puVar2;
          uStack_15b8 = puVar78[-3];
          *(int *)(puVar78 + -3) = (int)puVar78[-1];
          *puVar2 = *puVar3;
          *puVar3 = local_15c0;
          *(undefined4 *)(puVar78 + -1) = (undefined4)uStack_15b8;
        }
        if (uVar84 != 2) {
          puVar4 = puVar78 + -6;
          uVar83 = (uint)puVar78[-5];
          if (uVar83 < (uint)puVar78[-1]) {
            local_15c0 = *puVar4;
            uStack_15b8 = puVar78[-5];
            *(int *)(puVar78 + -5) = (int)puVar78[-1];
            *puVar4 = *puVar3;
            *puVar3 = local_15c0;
            *(undefined4 *)(puVar78 + -1) = (undefined4)uStack_15b8;
            uVar83 = (uint)puVar78[-5];
          }
          if (uVar83 < (uint)puVar78[-3]) {
            local_15c0 = *puVar4;
            uStack_15b8 = puVar78[-5];
            *(int *)(puVar78 + -5) = (int)puVar78[-3];
            *puVar4 = *puVar2;
            *puVar2 = local_15c0;
            *(undefined4 *)(puVar78 + -3) = (undefined4)uStack_15b8;
          }
        }
      }
    }
    if (puVar78 == &local_fa0) goto LAB_00397512;
  }
  goto LAB_003974c6;
LAB_0039696c:
  do {
    lVar80 = lVar81 * 0xe0 + (uVar89 & 0xfffffffffffffff0);
    lVar91 = 0;
    do {
      uVar83 = *(uint *)(lVar86 + lVar91 * 4);
      if ((ulong)uVar83 == 0xffffffff) break;
      fVar121 = *(float *)(lVar86 + -0xc0 + lVar91 * 4);
      auVar209._4_4_ = fVar121;
      auVar209._0_4_ = fVar121;
      auVar209._8_4_ = fVar121;
      auVar209._12_4_ = fVar121;
      auVar209._16_4_ = fVar121;
      auVar209._20_4_ = fVar121;
      auVar209._24_4_ = fVar121;
      auVar209._28_4_ = fVar121;
      fVar116 = *(float *)(lVar86 + -0xb0 + lVar91 * 4);
      auVar169._4_4_ = fVar116;
      auVar169._0_4_ = fVar116;
      auVar169._8_4_ = fVar116;
      auVar169._12_4_ = fVar116;
      auVar169._16_4_ = fVar116;
      auVar169._20_4_ = fVar116;
      auVar169._24_4_ = fVar116;
      auVar169._28_4_ = fVar116;
      fVar117 = *(float *)(lVar86 + -0xa0 + lVar91 * 4);
      auVar186._4_4_ = fVar117;
      auVar186._0_4_ = fVar117;
      auVar186._8_4_ = fVar117;
      auVar186._12_4_ = fVar117;
      auVar186._16_4_ = fVar117;
      auVar186._20_4_ = fVar117;
      auVar186._24_4_ = fVar117;
      auVar186._28_4_ = fVar117;
      local_14a0._4_4_ = *(float *)(lVar86 + -0x90 + lVar91 * 4);
      local_15a0._4_4_ = *(float *)(lVar86 + -0x80 + lVar91 * 4);
      local_1580._4_4_ = *(float *)(lVar86 + -0x70 + lVar91 * 4);
      local_1440._4_4_ = *(undefined4 *)(lVar86 + -0x60 + lVar91 * 4);
      local_1440._0_4_ = local_1440._4_4_;
      local_1440._8_4_ = local_1440._4_4_;
      local_1440._12_4_ = local_1440._4_4_;
      local_1440._16_4_ = local_1440._4_4_;
      local_1440._20_4_ = local_1440._4_4_;
      local_1440._24_4_ = local_1440._4_4_;
      local_1440._28_4_ = local_1440._4_4_;
      local_1500._4_4_ = *(undefined4 *)(lVar86 + -0x50 + lVar91 * 4);
      local_1500._0_4_ = local_1500._4_4_;
      local_1500._8_4_ = local_1500._4_4_;
      local_1500._12_4_ = local_1500._4_4_;
      local_1500._16_4_ = local_1500._4_4_;
      local_1500._20_4_ = local_1500._4_4_;
      local_1500._24_4_ = local_1500._4_4_;
      local_1500._28_4_ = local_1500._4_4_;
      uVar6 = *(undefined4 *)(lVar86 + -0x40 + lVar91 * 4);
      local_13e0._4_4_ = *(float *)(lVar86 + -0x30 + lVar91 * 4);
      local_fe0 = *(float *)(lVar86 + -0x20 + lVar91 * 4);
      local_1000 = *(float *)(lVar86 + -0x10 + lVar91 * 4);
      local_15c0 = *(ulong *)(lVar80 + 0xd0);
      uStack_15b8 = *(undefined8 *)(lVar80 + 0xd8);
      local_15a0._0_4_ = local_15a0._4_4_;
      fStack_1598 = (float)local_15a0._4_4_;
      fStack_1594 = (float)local_15a0._4_4_;
      fStack_1590 = (float)local_15a0._4_4_;
      fStack_158c = (float)local_15a0._4_4_;
      fStack_1588 = (float)local_15a0._4_4_;
      fStack_1584 = (float)local_15a0._4_4_;
      fVar140 = fVar116 - (float)local_15a0._4_4_;
      local_1580._0_4_ = local_1580._4_4_;
      fStack_1578 = (float)local_1580._4_4_;
      fStack_1574 = (float)local_1580._4_4_;
      fStack_1570 = (float)local_1580._4_4_;
      fStack_156c = (float)local_1580._4_4_;
      fStack_1568 = (float)local_1580._4_4_;
      fStack_1564 = (float)local_1580._4_4_;
      fVar115 = fVar117 - (float)local_1580._4_4_;
      fStack_fdc = local_fe0;
      fStack_fd8 = local_fe0;
      fStack_fd4 = local_fe0;
      fStack_fd0 = local_fe0;
      fStack_fcc = local_fe0;
      fStack_fc8 = local_fe0;
      fStack_fc4 = local_fe0;
      fVar116 = local_fe0 - fVar116;
      fStack_ffc = local_1000;
      fStack_ff8 = local_1000;
      fStack_ff4 = local_1000;
      fStack_ff0 = local_1000;
      fStack_fec = local_1000;
      fStack_fe8 = local_1000;
      fStack_fe4 = local_1000;
      fVar117 = local_1000 - fVar117;
      local_14a0._0_4_ = local_14a0._4_4_;
      fStack_1498 = (float)local_14a0._4_4_;
      fStack_1494 = (float)local_14a0._4_4_;
      fStack_1490 = (float)local_14a0._4_4_;
      fStack_148c = (float)local_14a0._4_4_;
      fStack_1488 = (float)local_14a0._4_4_;
      fStack_1484 = (float)local_14a0._4_4_;
      fVar27 = fVar121 - (float)local_14a0._4_4_;
      local_13e0._0_4_ = local_13e0._4_4_;
      fStack_13d8 = (float)local_13e0._4_4_;
      fStack_13d4 = (float)local_13e0._4_4_;
      fStack_13d0 = (float)local_13e0._4_4_;
      fStack_13cc = (float)local_13e0._4_4_;
      fStack_13c8 = (float)local_13e0._4_4_;
      fStack_13c4 = (float)local_13e0._4_4_;
      fVar121 = (float)local_13e0._4_4_ - fVar121;
      local_11a0 = *(undefined1 (*) [32])(ray + 0x20);
      local_1020 = vsubps_avx(auVar169,*(undefined1 (*) [32])(ray + 0x20));
      local_11e0 = *(undefined1 (*) [32])(ray + 0x40);
      auVar133 = vsubps_avx(auVar186,local_11e0);
      local_1180 = *(float *)(ray + 0xa0);
      fStack_117c = *(float *)(ray + 0xa4);
      fStack_1178 = *(float *)(ray + 0xa8);
      fStack_1174 = *(float *)(ray + 0xac);
      fStack_1170 = *(float *)(ray + 0xb0);
      fStack_116c = *(float *)(ray + 0xb4);
      fStack_1168 = *(float *)(ray + 0xb8);
      fVar178 = auVar133._0_4_;
      fVar179 = auVar133._4_4_;
      auVar32._4_4_ = fVar179 * fStack_117c;
      auVar32._0_4_ = fVar178 * local_1180;
      fVar180 = auVar133._8_4_;
      auVar32._8_4_ = fVar180 * fStack_1178;
      fVar181 = auVar133._12_4_;
      auVar32._12_4_ = fVar181 * fStack_1174;
      fVar188 = auVar133._16_4_;
      auVar32._16_4_ = fVar188 * fStack_1170;
      fVar197 = auVar133._20_4_;
      auVar32._20_4_ = fVar197 * fStack_116c;
      fVar198 = auVar133._24_4_;
      auVar32._24_4_ = fVar198 * fStack_1168;
      auVar32._28_4_ = local_11e0._28_4_;
      fVar11 = *(float *)(ray + 0xc0);
      fVar12 = *(float *)(ray + 0xc4);
      fVar13 = *(float *)(ray + 200);
      fVar14 = *(float *)(ray + 0xcc);
      fVar15 = *(float *)(ray + 0xd0);
      fVar16 = *(float *)(ray + 0xd4);
      fVar17 = *(float *)(ray + 0xd8);
      fVar145 = local_1020._0_4_;
      auVar135._0_4_ = fVar145 * fVar11;
      fVar147 = local_1020._4_4_;
      auVar135._4_4_ = fVar147 * fVar12;
      fVar148 = local_1020._8_4_;
      auVar135._8_4_ = fVar148 * fVar13;
      fVar150 = local_1020._12_4_;
      auVar135._12_4_ = fVar150 * fVar14;
      fVar152 = local_1020._16_4_;
      auVar135._16_4_ = fVar152 * fVar15;
      fVar154 = local_1020._20_4_;
      auVar135._20_4_ = fVar154 * fVar16;
      fVar156 = local_1020._24_4_;
      auVar135._24_4_ = fVar156 * fVar17;
      auVar135._28_4_ = 0;
      auVar184 = vsubps_avx(auVar135,auVar32);
      local_1200 = *(undefined1 (*) [32])ray;
      local_1040 = vsubps_avx(auVar209,local_1200);
      fVar18 = *(float *)(ray + 0x80);
      fVar19 = *(float *)(ray + 0x84);
      fVar20 = *(float *)(ray + 0x88);
      fVar21 = *(float *)(ray + 0x8c);
      _local_1400 = *(undefined1 (*) [16])(ray + 0x80);
      fVar37 = *(float *)(ray + 0x90);
      fVar46 = *(float *)(ray + 0x94);
      uStack_13f0 = *(undefined8 *)(ray + 0x90);
      fStack_13e8 = *(float *)(ray + 0x98);
      fVar166 = local_1040._0_4_;
      fVar172 = local_1040._4_4_;
      auVar33._4_4_ = fVar172 * fVar12;
      auVar33._0_4_ = fVar166 * fVar11;
      fVar173 = local_1040._8_4_;
      auVar33._8_4_ = fVar173 * fVar13;
      fVar174 = local_1040._12_4_;
      auVar33._12_4_ = fVar174 * fVar14;
      fVar175 = local_1040._16_4_;
      auVar33._16_4_ = fVar175 * fVar15;
      fVar176 = local_1040._20_4_;
      auVar33._20_4_ = fVar176 * fVar16;
      fVar177 = local_1040._24_4_;
      auVar33._24_4_ = fVar177 * fVar17;
      auVar33._28_4_ = local_1200._28_4_;
      auVar34._4_4_ = fVar179 * fVar19;
      auVar34._0_4_ = fVar178 * fVar18;
      auVar34._8_4_ = fVar180 * fVar20;
      auVar34._12_4_ = fVar181 * fVar21;
      auVar34._16_4_ = fVar188 * fVar37;
      auVar34._20_4_ = fVar197 * fVar46;
      auVar34._24_4_ = fVar198 * fStack_13e8;
      auVar34._28_4_ = 0;
      auVar9 = vsubps_avx(auVar34,auVar33);
      auVar35._4_4_ = fVar19 * fVar147;
      auVar35._0_4_ = fVar18 * fVar145;
      auVar35._8_4_ = fVar20 * fVar148;
      auVar35._12_4_ = fVar21 * fVar150;
      auVar35._16_4_ = fVar37 * fVar152;
      auVar35._20_4_ = fVar46 * fVar154;
      auVar35._24_4_ = fStack_13e8 * fVar156;
      auVar35._28_4_ = local_1200._28_4_;
      auVar36._4_4_ = fVar172 * fStack_117c;
      auVar36._0_4_ = fVar166 * local_1180;
      auVar36._8_4_ = fVar173 * fStack_1178;
      auVar36._12_4_ = fVar174 * fStack_1174;
      auVar36._16_4_ = fVar175 * fStack_1170;
      auVar36._20_4_ = fVar176 * fStack_116c;
      auVar36._24_4_ = fVar177 * fStack_1168;
      auVar36._28_4_ = 0;
      auVar160 = vsubps_avx(auVar36,auVar35);
      auVar93 = ZEXT416((uint)(fVar117 * fVar27 - fVar121 * fVar115));
      auVar93 = vshufps_avx(auVar93,auVar93,0);
      local_1220._16_16_ = auVar93;
      local_1220._0_16_ = auVar93;
      auVar132 = ZEXT416((uint)(fVar121 * fVar140 - fVar116 * fVar27));
      auVar132 = vshufps_avx(auVar132,auVar132,0);
      local_1240._16_16_ = auVar132;
      local_1240._0_16_ = auVar132;
      local_11c0 = *(undefined8 *)(ray + 0xc0);
      uStack_11b8 = *(undefined8 *)(ray + 200);
      uStack_11b0 = *(undefined8 *)(ray + 0xd0);
      uStack_11a8 = *(undefined8 *)(ray + 0xd8);
      fVar127 = auVar132._0_4_;
      fVar129 = auVar132._4_4_;
      fVar130 = auVar132._8_4_;
      uStack_1164 = *(undefined4 *)(ray + 0xbc);
      fVar118 = auVar93._0_4_;
      fVar119 = auVar93._4_4_;
      fVar120 = auVar93._8_4_;
      fVar139 = auVar93._12_4_;
      auVar190 = vpermilps_avx(ZEXT416((uint)(fVar116 * fVar115 - fVar117 * fVar140)),0);
      auVar233._16_16_ = auVar190;
      auVar233._0_16_ = auVar190;
      fVar199 = auVar190._0_4_;
      fVar200 = auVar190._4_4_;
      fVar201 = auVar190._8_4_;
      auVar164._0_4_ = fVar199 * fVar18 + local_1180 * fVar118 + fVar127 * fVar11;
      auVar164._4_4_ = fVar200 * fVar19 + fStack_117c * fVar119 + fVar129 * fVar12;
      auVar164._8_4_ = fVar201 * fVar20 + fStack_1178 * fVar120 + fVar130 * fVar13;
      auVar164._12_4_ = auVar190._12_4_ * fVar21 + fStack_1174 * fVar139 + auVar132._12_4_ * fVar14;
      auVar164._16_4_ = fVar199 * fVar37 + fStack_1170 * fVar118 + fVar127 * fVar15;
      auVar164._20_4_ = fVar200 * fVar46 + fStack_116c * fVar119 + fVar129 * fVar16;
      auVar164._24_4_ = fVar201 * fStack_13e8 + fStack_1168 * fVar120 + fVar130 * fVar17;
      auVar164._28_4_ = fVar139 + 0.0 + 0.0;
      auVar93 = vshufps_avx(ZEXT416((uint)fVar116),ZEXT416((uint)fVar116),0);
      auVar189 = vshufps_avx(ZEXT416((uint)fVar117),ZEXT416((uint)fVar117),0);
      auVar10 = vshufps_avx(ZEXT416((uint)fVar121),ZEXT416((uint)fVar121),0);
      auVar123._8_4_ = 0x80000000;
      auVar123._0_8_ = 0x8000000080000000;
      auVar123._12_4_ = 0x80000000;
      auVar123._16_4_ = 0x80000000;
      auVar123._20_4_ = 0x80000000;
      auVar123._24_4_ = 0x80000000;
      auVar123._28_4_ = 0x80000000;
      auVar133 = vandps_avx(auVar164,auVar123);
      uVar149 = auVar133._0_4_;
      auVar210._0_4_ =
           (float)(uVar149 ^
                  (uint)(auVar184._0_4_ * auVar10._0_4_ +
                        auVar93._0_4_ * auVar9._0_4_ + auVar189._0_4_ * auVar160._0_4_));
      uVar151 = auVar133._4_4_;
      auVar210._4_4_ =
           (float)(uVar151 ^
                  (uint)(auVar184._4_4_ * auVar10._4_4_ +
                        auVar93._4_4_ * auVar9._4_4_ + auVar189._4_4_ * auVar160._4_4_));
      uVar153 = auVar133._8_4_;
      auVar210._8_4_ =
           (float)(uVar153 ^
                  (uint)(auVar184._8_4_ * auVar10._8_4_ +
                        auVar93._8_4_ * auVar9._8_4_ + auVar189._8_4_ * auVar160._8_4_));
      uVar155 = auVar133._12_4_;
      auVar210._12_4_ =
           (float)(uVar155 ^
                  (uint)(auVar184._12_4_ * auVar10._12_4_ +
                        auVar93._12_4_ * auVar9._12_4_ + auVar189._12_4_ * auVar160._12_4_));
      uVar157 = auVar133._16_4_;
      auVar210._16_4_ =
           (float)(uVar157 ^
                  (uint)(auVar184._16_4_ * auVar10._0_4_ +
                        auVar93._0_4_ * auVar9._16_4_ + auVar189._0_4_ * auVar160._16_4_));
      uVar158 = auVar133._20_4_;
      auVar210._20_4_ =
           (float)(uVar158 ^
                  (uint)(auVar184._20_4_ * auVar10._4_4_ +
                        auVar93._4_4_ * auVar9._20_4_ + auVar189._4_4_ * auVar160._20_4_));
      uVar236 = auVar133._24_4_;
      auVar210._24_4_ =
           (float)(uVar236 ^
                  (uint)(auVar184._24_4_ * auVar10._8_4_ +
                        auVar93._8_4_ * auVar9._24_4_ + auVar189._8_4_ * auVar160._24_4_));
      uVar237 = auVar133._28_4_;
      auVar210._28_4_ = uVar237 ^ (uint)(auVar10._12_4_ + auVar93._12_4_ + auVar189._12_4_);
      auVar95 = vcmpps_avx(auVar210,_DAT_01faff00,5);
      auVar23 = auVar185 & auVar95;
      auVar128 = local_1240;
      auVar133 = auVar185;
      if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar23 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar23 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar23 >> 0x7f,0) == '\0') &&
            (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar23 >> 0xbf,0) == '\0') &&
          (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar23[0x1f])
      {
LAB_00396c28:
        uVar73 = auVar133._28_4_;
LAB_00396c31:
        auVar141 = ZEXT436(uVar73);
        auVar131 = ZEXT436(auVar128._28_4_);
        auVar146._4_4_ = uVar6;
        auVar146._0_4_ = uVar6;
        auVar146._8_4_ = uVar6;
        auVar146._12_4_ = uVar6;
        auVar146._16_4_ = uVar6;
        auVar146._20_4_ = uVar6;
        auVar146._24_4_ = uVar6;
        auVar146._28_4_ = uVar6;
      }
      else {
        auVar60._4_4_ = uVar6;
        auVar60._0_4_ = uVar6;
        auVar60._8_4_ = uVar6;
        auVar60._12_4_ = uVar6;
        auVar60._16_4_ = uVar6;
        auVar60._20_4_ = uVar6;
        auVar60._24_4_ = uVar6;
        auVar60._28_4_ = uVar6;
        auVar189 = vpermilps_avx(ZEXT416((uint)fVar27),0);
        auVar10 = vpermilps_avx(ZEXT416((uint)fVar140),0);
        auVar142 = vpermilps_avx(ZEXT416((uint)fVar115),0);
        auVar133 = vandps_avx(auVar95,auVar185);
        auVar93 = vpackssdw_avx(auVar133._0_16_,auVar133._16_16_);
        auVar141 = (undefined1  [36])0x0;
        auVar128._0_4_ =
             (float)(uVar149 ^
                    (uint)(auVar184._0_4_ * auVar189._0_4_ +
                          auVar10._0_4_ * auVar9._0_4_ + auVar142._0_4_ * auVar160._0_4_));
        auVar128._4_4_ =
             (float)(uVar151 ^
                    (uint)(auVar184._4_4_ * auVar189._4_4_ +
                          auVar10._4_4_ * auVar9._4_4_ + auVar142._4_4_ * auVar160._4_4_));
        auVar128._8_4_ =
             (float)(uVar153 ^
                    (uint)(auVar184._8_4_ * auVar189._8_4_ +
                          auVar10._8_4_ * auVar9._8_4_ + auVar142._8_4_ * auVar160._8_4_));
        auVar128._12_4_ =
             (float)(uVar155 ^
                    (uint)(auVar184._12_4_ * auVar189._12_4_ +
                          auVar10._12_4_ * auVar9._12_4_ + auVar142._12_4_ * auVar160._12_4_));
        auVar128._16_4_ =
             (float)(uVar157 ^
                    (uint)(auVar184._16_4_ * auVar189._0_4_ +
                          auVar10._0_4_ * auVar9._16_4_ + auVar142._0_4_ * auVar160._16_4_));
        auVar128._20_4_ =
             (float)(uVar158 ^
                    (uint)(auVar184._20_4_ * auVar189._4_4_ +
                          auVar10._4_4_ * auVar9._20_4_ + auVar142._4_4_ * auVar160._20_4_));
        auVar128._24_4_ =
             (float)(uVar236 ^
                    (uint)(auVar184._24_4_ * auVar189._8_4_ +
                          auVar10._8_4_ * auVar9._24_4_ + auVar142._8_4_ * auVar160._24_4_));
        auVar128._28_4_ = uVar237 ^ (uint)(auVar189._12_4_ + auVar10._12_4_ + auVar142._12_4_);
        auVar131 = ZEXT436(auVar128._28_4_);
        auVar133 = vcmpps_avx(auVar128,_DAT_01faff00,5);
        auVar189 = vpackssdw_avx(auVar133._0_16_,auVar133._16_16_);
        auVar93 = vpand_avx(auVar93,auVar189);
        auVar189 = vpmovsxwd_avx(auVar93);
        auVar10 = vpunpckhwd_avx(auVar93,auVar93);
        auVar97._16_16_ = auVar10;
        auVar97._0_16_ = auVar189;
        auVar146 = auVar60;
        if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar97 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar97 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar97 >> 0x7f,0) != '\0') ||
              (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB161(auVar10 >> 0x3f,0) != '\0') ||
            (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar10[0xf] < '\0') {
          auVar107._8_4_ = 0x7fffffff;
          auVar107._0_8_ = 0x7fffffff7fffffff;
          auVar107._12_4_ = 0x7fffffff;
          auVar107._16_4_ = 0x7fffffff;
          auVar107._20_4_ = 0x7fffffff;
          auVar107._24_4_ = 0x7fffffff;
          auVar107._28_4_ = 0x7fffffff;
          auVar133 = vandps_avx(auVar164,auVar107);
          uVar73 = auVar133._28_4_;
          auVar141 = ZEXT436(uVar73);
          auVar95 = vsubps_avx(auVar133,auVar210);
          auVar95 = vcmpps_avx(auVar95,auVar128,5);
          auVar189 = vpackssdw_avx(auVar95._0_16_,auVar95._16_16_);
          auVar93 = vpand_avx(auVar93,auVar189);
          auVar189 = vpmovsxwd_avx(auVar93);
          auVar10 = vpunpckhwd_avx(auVar93,auVar93);
          auVar108._16_16_ = auVar10;
          auVar108._0_16_ = auVar189;
          if ((((((((auVar108 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar108 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar108 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar108 >> 0x7f,0) != '\0') ||
                (auVar108 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar10 >> 0x3f,0) != '\0') ||
              (auVar108 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar10[0xf] < '\0') {
            fVar121 = (float)local_1020._28_4_ + (float)local_1020._28_4_ + auVar10._12_4_;
            auVar162._0_4_ =
                 (float)(uVar149 ^ (uint)(fVar199 * fVar166 + fVar145 * fVar118 + fVar178 * fVar127)
                        );
            auVar162._4_4_ =
                 (float)(uVar151 ^ (uint)(fVar200 * fVar172 + fVar147 * fVar119 + fVar179 * fVar129)
                        );
            auVar162._8_4_ =
                 (float)(uVar153 ^ (uint)(fVar201 * fVar173 + fVar148 * fVar120 + fVar180 * fVar130)
                        );
            auVar162._12_4_ =
                 (float)(uVar155 ^
                        (uint)(auVar190._12_4_ * fVar174 +
                              fVar150 * fVar139 + fVar181 * auVar132._12_4_));
            auVar162._16_4_ =
                 (float)(uVar157 ^ (uint)(fVar199 * fVar175 + fVar152 * fVar118 + fVar188 * fVar127)
                        );
            auVar162._20_4_ =
                 (float)(uVar158 ^ (uint)(fVar200 * fVar176 + fVar154 * fVar119 + fVar197 * fVar129)
                        );
            auVar162._24_4_ =
                 (float)(uVar236 ^ (uint)(fVar201 * fVar177 + fVar156 * fVar120 + fVar198 * fVar130)
                        );
            auVar162._28_4_ = uVar237 ^ (uint)fVar121;
            fVar116 = auVar133._0_4_;
            fVar117 = auVar133._4_4_;
            auVar54._4_4_ = fVar117 * *(float *)(ray + 100);
            auVar54._0_4_ = fVar116 * *(float *)(ray + 0x60);
            fVar118 = auVar133._8_4_;
            auVar54._8_4_ = fVar118 * *(float *)(ray + 0x68);
            fVar119 = auVar133._12_4_;
            auVar54._12_4_ = fVar119 * *(float *)(ray + 0x6c);
            fVar120 = auVar133._16_4_;
            auVar54._16_4_ = fVar120 * *(float *)(ray + 0x70);
            fVar139 = auVar133._20_4_;
            auVar54._20_4_ = fVar139 * *(float *)(ray + 0x74);
            fVar140 = auVar133._24_4_;
            auVar54._24_4_ = fVar140 * *(float *)(ray + 0x78);
            auVar54._28_4_ = fVar121;
            auVar95 = vcmpps_avx(auVar54,auVar162,1);
            auVar55._4_4_ = fVar117 * *(float *)(ray + 0x104);
            auVar55._0_4_ = fVar116 * *(float *)(ray + 0x100);
            auVar55._8_4_ = fVar118 * *(float *)(ray + 0x108);
            auVar55._12_4_ = fVar119 * *(float *)(ray + 0x10c);
            auVar55._16_4_ = fVar120 * *(float *)(ray + 0x110);
            auVar55._20_4_ = fVar139 * *(float *)(ray + 0x114);
            auVar55._24_4_ = fVar140 * *(float *)(ray + 0x118);
            auVar55._28_4_ = local_1020._28_4_;
            auVar184 = vcmpps_avx(auVar162,auVar55,2);
            auVar95 = vandps_avx(auVar95,auVar184);
            auVar132 = vpackssdw_avx(auVar95._0_16_,auVar95._16_16_);
            auVar93 = vpand_avx(auVar132,auVar93);
            auVar132 = vpmovsxwd_avx(auVar93);
            auVar189 = vpshufd_avx(auVar93,0xee);
            auVar189 = vpmovsxwd_avx(auVar189);
            auVar109._16_16_ = auVar189;
            auVar109._0_16_ = auVar132;
            if ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar109 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar109 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar109 >> 0x7f,0) == '\0') &&
                  (auVar109 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB161(auVar189 >> 0x3f,0) == '\0') &&
                (auVar109 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar189[0xf]) goto LAB_00396c31;
            auVar95 = vcmpps_avx(auVar164,_DAT_01faff00,4);
            auVar132 = vpackssdw_avx(auVar95._0_16_,auVar95._16_16_);
            auVar93 = vpand_avx(auVar93,auVar132);
            auVar132 = vpmovsxwd_avx(auVar93);
            auVar93 = vpunpckhwd_avx(auVar93,auVar93);
            auVar110._16_16_ = auVar93;
            auVar110._0_16_ = auVar132;
            if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar110 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar110 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar110 >> 0x7f,0) == '\0') &&
                  (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB161(auVar93 >> 0x3f,0) == '\0') &&
                (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar93[0xf]) goto LAB_00396c28;
            auVar128._28_4_ = ((context->scene->geometries).items[uVar83].ptr)->mask;
            auVar111._4_4_ = auVar128._28_4_;
            auVar111._0_4_ = auVar128._28_4_;
            auVar111._8_4_ = auVar128._28_4_;
            auVar111._12_4_ = auVar128._28_4_;
            auVar111._16_4_ = auVar128._28_4_;
            auVar111._20_4_ = auVar128._28_4_;
            auVar111._24_4_ = auVar128._28_4_;
            auVar111._28_4_ = auVar128._28_4_;
            auVar95 = vandps_avx(auVar111,*(undefined1 (*) [32])(ray + 0x120));
            auVar10._12_4_ = 0;
            auVar10._0_12_ = ZEXT412(0);
            auVar131 = (undefined1  [36])0x0;
            auVar189 = vpcmpeqd_avx(auVar95._16_16_,auVar10 << 0x20);
            auVar10 = vpcmpeqd_avx(auVar95._0_16_,auVar10 << 0x20);
            auVar126._16_16_ = auVar189;
            auVar126._0_16_ = auVar10;
            auVar95 = vblendps_avx(ZEXT1632(auVar10),auVar126,0xf0);
            auVar196._16_16_ = auVar93;
            auVar196._0_16_ = auVar132;
            auVar184 = auVar196 & ~auVar95;
            auVar146._4_4_ = uVar6;
            auVar146._0_4_ = uVar6;
            auVar146._8_4_ = uVar6;
            auVar146._12_4_ = uVar6;
            auVar146._16_4_ = uVar6;
            auVar146._20_4_ = uVar6;
            auVar146._24_4_ = uVar6;
            auVar146._28_4_ = uVar6;
            if ((((((((auVar184 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar184 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar184 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar184 >> 0x7f,0) != '\0') ||
                  (auVar184 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar184 >> 0xbf,0) != '\0') ||
                (auVar184 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar184[0x1f] < '\0') {
              auVar160 = vrcpps_avx(auVar133);
              fVar121 = auVar160._0_4_;
              fVar115 = auVar160._4_4_;
              auVar56._4_4_ = fVar117 * fVar115;
              auVar56._0_4_ = fVar116 * fVar121;
              fVar116 = auVar160._8_4_;
              auVar56._8_4_ = fVar118 * fVar116;
              fVar117 = auVar160._12_4_;
              auVar56._12_4_ = fVar119 * fVar117;
              fVar118 = auVar160._16_4_;
              auVar56._16_4_ = fVar120 * fVar118;
              fVar119 = auVar160._20_4_;
              auVar56._20_4_ = fVar139 * fVar119;
              fVar120 = auVar160._24_4_;
              auVar56._24_4_ = fVar140 * fVar120;
              auVar56._28_4_ = auVar189._12_4_;
              auVar138._8_4_ = 0x3f800000;
              auVar138._0_8_ = 0x3f8000003f800000;
              auVar138._12_4_ = 0x3f800000;
              auVar138._16_4_ = 0x3f800000;
              auVar138._20_4_ = 0x3f800000;
              auVar138._24_4_ = 0x3f800000;
              auVar138._28_4_ = 0x3f800000;
              auVar23 = vsubps_avx(auVar138,auVar56);
              fVar121 = fVar121 + fVar121 * auVar23._0_4_;
              fVar115 = fVar115 + fVar115 * auVar23._4_4_;
              fVar116 = fVar116 + fVar116 * auVar23._8_4_;
              fVar117 = fVar117 + fVar117 * auVar23._12_4_;
              fVar118 = fVar118 + fVar118 * auVar23._16_4_;
              fVar119 = fVar119 + fVar119 * auVar23._20_4_;
              fVar120 = fVar120 + fVar120 * auVar23._24_4_;
              auVar57._4_4_ = fVar115 * auVar128._4_4_;
              auVar57._0_4_ = fVar121 * auVar128._0_4_;
              auVar57._8_4_ = fVar116 * auVar128._8_4_;
              auVar57._12_4_ = fVar117 * auVar128._12_4_;
              auVar57._16_4_ = fVar118 * auVar128._16_4_;
              auVar57._20_4_ = fVar119 * auVar128._20_4_;
              auVar57._24_4_ = fVar120 * auVar128._24_4_;
              auVar57._28_4_ = auVar23._28_4_;
              auVar133 = vminps_avx(auVar57,auVar138);
              auVar9 = vsubps_avx(auVar138,auVar133);
              auVar63._8_8_ = uVar75;
              auVar63._0_8_ = uVar74;
              auVar63._16_8_ = uVar74;
              auVar63._24_8_ = uVar75;
              auVar184 = vblendvps_avx(auVar133,auVar9,auVar63);
              auVar58._4_4_ = fVar115 * auVar210._4_4_;
              auVar58._0_4_ = fVar121 * auVar210._0_4_;
              auVar58._8_4_ = fVar116 * auVar210._8_4_;
              auVar58._12_4_ = fVar117 * auVar210._12_4_;
              auVar58._16_4_ = fVar118 * auVar210._16_4_;
              auVar58._20_4_ = fVar119 * auVar210._20_4_;
              auVar58._24_4_ = fVar120 * auVar210._24_4_;
              auVar58._28_4_ = auVar9._28_4_;
              auVar133 = vminps_avx(auVar58,auVar138);
              auVar9 = vsubps_avx(auVar138,auVar133);
              auVar9 = vblendvps_avx(auVar133,auVar9,auVar63);
              auVar131 = ZEXT436(auVar9._28_4_);
              auVar95 = vandnps_avx(auVar95,auVar196);
              auVar141 = ZEXT436(auVar95._28_4_);
              auVar59._4_4_ = fVar115 * auVar162._4_4_;
              auVar59._0_4_ = fVar121 * auVar162._0_4_;
              auVar59._8_4_ = fVar116 * auVar162._8_4_;
              auVar59._12_4_ = fVar117 * auVar162._12_4_;
              auVar59._16_4_ = fVar118 * auVar162._16_4_;
              auVar59._20_4_ = fVar119 * auVar162._20_4_;
              auVar59._24_4_ = fVar120 * auVar162._24_4_;
              auVar59._28_4_ = auVar160._28_4_ + auVar23._28_4_;
              uVar6 = *(undefined4 *)((long)&local_15c0 + lVar91 * 4);
              auVar171._4_4_ = uVar6;
              auVar171._0_4_ = uVar6;
              auVar171._8_4_ = uVar6;
              auVar171._12_4_ = uVar6;
              auVar171._16_4_ = uVar6;
              auVar171._20_4_ = uVar6;
              auVar171._24_4_ = uVar6;
              auVar171._28_4_ = uVar6;
              auVar133 = vmaskmovps_avx(auVar95,auVar59);
              *(undefined1 (*) [32])pRVar1 = auVar133;
              auVar133 = vmaskmovps_avx(auVar95,auVar233);
              *(undefined1 (*) [32])(ray + 0x180) = auVar133;
              auVar133 = vmaskmovps_avx(auVar95,local_1220);
              *(undefined1 (*) [32])(ray + 0x1a0) = auVar133;
              auVar133 = vmaskmovps_avx(auVar95,local_1240);
              *(undefined1 (*) [32])(ray + 0x1c0) = auVar133;
              auVar133 = vmaskmovps_avx(auVar95,auVar9);
              *(undefined1 (*) [32])(ray + 0x1e0) = auVar133;
              auVar133 = vmaskmovps_avx(auVar95,auVar184);
              *(undefined1 (*) [32])(ray + 0x200) = auVar133;
              auVar133 = vmaskmovps_avx(auVar95,auVar171);
              *(undefined1 (*) [32])(ray + 0x220) = auVar133;
              auVar93 = vpshufd_avx(ZEXT416(uVar83),0);
              auVar112._16_16_ = auVar93;
              auVar112._0_16_ = auVar93;
              auVar133 = vmaskmovps_avx(auVar95,auVar112);
              *(undefined1 (*) [32])(ray + 0x240) = auVar133;
              uVar83 = context->user->instID[0];
              auVar113._4_4_ = uVar83;
              auVar113._0_4_ = uVar83;
              auVar113._8_4_ = uVar83;
              auVar113._12_4_ = uVar83;
              auVar113._16_4_ = uVar83;
              auVar113._20_4_ = uVar83;
              auVar113._24_4_ = uVar83;
              auVar113._28_4_ = uVar83;
              auVar133 = vmaskmovps_avx(auVar95,auVar113);
              *(undefined1 (*) [32])(ray + 0x260) = auVar133;
              uVar83 = context->user->instPrimID[0];
              auVar114._4_4_ = uVar83;
              auVar114._0_4_ = uVar83;
              auVar114._8_4_ = uVar83;
              auVar114._12_4_ = uVar83;
              auVar114._16_4_ = uVar83;
              auVar114._20_4_ = uVar83;
              auVar114._24_4_ = uVar83;
              auVar114._28_4_ = uVar83;
              auVar133 = vmaskmovps_avx(auVar95,auVar114);
              *(undefined1 (*) [32])(ray + 0x280) = auVar133;
              local_1200 = *(undefined1 (*) [32])ray;
              local_11a0 = *(undefined1 (*) [32])(ray + 0x20);
              local_11e0 = *(undefined1 (*) [32])(ray + 0x40);
              _local_1400 = *(undefined1 (*) [16])(ray + 0x80);
              uStack_13f0 = *(undefined8 *)(ray + 0x90);
              fStack_13e8 = (float)*(undefined8 *)(ray + 0x98);
              local_1180 = (float)*(undefined8 *)(ray + 0xa0);
              fStack_117c = (float)((ulong)*(undefined8 *)(ray + 0xa0) >> 0x20);
              fStack_1178 = (float)*(undefined8 *)(ray + 0xa8);
              fStack_1174 = (float)((ulong)*(undefined8 *)(ray + 0xa8) >> 0x20);
              fStack_1170 = (float)*(undefined8 *)(ray + 0xb0);
              fStack_116c = (float)((ulong)*(undefined8 *)(ray + 0xb0) >> 0x20);
              fStack_1168 = (float)*(undefined8 *)(ray + 0xb8);
              uStack_1164 = (undefined4)((ulong)*(undefined8 *)(ray + 0xb8) >> 0x20);
              local_11c0 = *(undefined8 *)(ray + 0xc0);
              uStack_11b8 = *(undefined8 *)(ray + 200);
              uStack_11b0 = *(undefined8 *)(ray + 0xd0);
              uStack_11a8 = *(undefined8 *)(ray + 0xd8);
              auVar146 = auVar60;
            }
          }
        }
      }
      auVar65._4_4_ = local_fe0;
      auVar65._0_4_ = local_fe0;
      auVar65._8_4_ = local_fe0;
      auVar65._12_4_ = local_fe0;
      auVar65._16_4_ = local_fe0;
      auVar65._20_4_ = local_fe0;
      auVar65._24_4_ = local_fe0;
      auVar65._28_4_ = local_fe0;
      auVar95 = vsubps_avx(local_1500,auVar65);
      auVar64._4_4_ = local_1000;
      auVar64._0_4_ = local_1000;
      auVar64._8_4_ = local_1000;
      auVar64._12_4_ = local_1000;
      auVar64._16_4_ = local_1000;
      auVar64._20_4_ = local_1000;
      auVar64._24_4_ = local_1000;
      auVar64._28_4_ = local_1000;
      auVar133 = vsubps_avx(auVar146,auVar64);
      auVar184 = vsubps_avx(_local_15a0,local_1500);
      auVar9 = vsubps_avx(_local_1580,auVar146);
      fVar121 = auVar9._0_4_;
      fVar152 = auVar95._0_4_;
      auVar187._0_4_ = fVar152 * fVar121;
      fVar118 = auVar9._4_4_;
      fVar156 = auVar95._4_4_;
      auVar187._4_4_ = fVar156 * fVar118;
      fVar139 = auVar9._8_4_;
      fVar172 = auVar95._8_4_;
      auVar187._8_4_ = fVar172 * fVar139;
      fVar27 = auVar9._12_4_;
      fVar174 = auVar95._12_4_;
      auVar187._12_4_ = fVar174 * fVar27;
      fVar13 = auVar9._16_4_;
      fVar176 = auVar95._16_4_;
      auVar187._16_4_ = fVar176 * fVar13;
      fVar16 = auVar9._20_4_;
      fVar178 = auVar95._20_4_;
      auVar187._20_4_ = fVar178 * fVar16;
      fVar19 = auVar9._24_4_;
      fVar180 = auVar95._24_4_;
      auVar187._24_4_ = fVar180 * fVar19;
      auVar187._28_36_ = auVar131;
      fVar116 = auVar184._0_4_;
      fVar188 = auVar133._0_4_;
      auVar212._0_4_ = fVar188 * fVar116;
      fVar119 = auVar184._4_4_;
      fVar197 = auVar133._4_4_;
      auVar212._4_4_ = fVar197 * fVar119;
      fVar140 = auVar184._8_4_;
      fVar198 = auVar133._8_4_;
      auVar212._8_4_ = fVar198 * fVar140;
      fVar11 = auVar184._12_4_;
      fVar199 = auVar133._12_4_;
      auVar212._12_4_ = fVar199 * fVar11;
      fVar14 = auVar184._16_4_;
      fVar200 = auVar133._16_4_;
      auVar212._16_4_ = fVar200 * fVar14;
      fVar17 = auVar184._20_4_;
      fVar201 = auVar133._20_4_;
      auVar212._20_4_ = fVar201 * fVar17;
      fVar20 = auVar184._24_4_;
      fVar202 = auVar133._24_4_;
      auVar212._24_4_ = fVar202 * fVar20;
      auVar212._28_36_ = auVar141;
      auVar160 = vsubps_avx(auVar212._0_32_,auVar187._0_32_);
      auVar133 = vsubps_avx(local_1440,_local_13e0);
      auVar23 = vsubps_avx(_local_14a0,local_1440);
      fVar117 = auVar23._0_4_;
      fVar120 = auVar23._4_4_;
      auVar38._4_4_ = fVar197 * fVar120;
      auVar38._0_4_ = fVar188 * fVar117;
      fVar115 = auVar23._8_4_;
      auVar38._8_4_ = fVar198 * fVar115;
      fVar12 = auVar23._12_4_;
      auVar38._12_4_ = fVar199 * fVar12;
      fVar15 = auVar23._16_4_;
      auVar38._16_4_ = fVar200 * fVar15;
      fVar18 = auVar23._20_4_;
      auVar38._20_4_ = fVar201 * fVar18;
      fVar21 = auVar23._24_4_;
      fVar37 = auVar141._0_4_;
      auVar38._24_4_ = fVar202 * fVar21;
      auVar38._28_4_ = fVar37;
      fVar220 = auVar133._0_4_;
      fVar225 = auVar133._4_4_;
      auVar66._4_4_ = fVar225 * fVar118;
      auVar66._0_4_ = fVar220 * fVar121;
      fVar226 = auVar133._8_4_;
      auVar66._8_4_ = fVar226 * fVar139;
      fVar227 = auVar133._12_4_;
      auVar66._12_4_ = fVar227 * fVar27;
      fVar228 = auVar133._16_4_;
      auVar66._16_4_ = fVar228 * fVar13;
      fVar229 = auVar133._20_4_;
      auVar66._20_4_ = fVar229 * fVar16;
      fVar230 = auVar133._24_4_;
      auVar66._24_4_ = fVar230 * fVar19;
      auVar66._28_4_ = local_14a0._4_4_;
      _local_1580 = vsubps_avx(auVar66,auVar38);
      auVar39._4_4_ = fVar225 * fVar119;
      auVar39._0_4_ = fVar220 * fVar116;
      auVar39._8_4_ = fVar226 * fVar140;
      auVar39._12_4_ = fVar227 * fVar11;
      auVar39._16_4_ = fVar228 * fVar14;
      auVar39._20_4_ = fVar229 * fVar17;
      auVar39._24_4_ = fVar230 * fVar20;
      auVar39._28_4_ = fVar37;
      auVar40._4_4_ = fVar156 * fVar120;
      auVar40._0_4_ = fVar152 * fVar117;
      auVar40._8_4_ = fVar172 * fVar115;
      auVar40._12_4_ = fVar174 * fVar12;
      auVar40._16_4_ = fVar176 * fVar15;
      auVar40._20_4_ = fVar178 * fVar18;
      auVar40._24_4_ = fVar180 * fVar21;
      auVar40._28_4_ = local_14a0._4_4_;
      auVar24 = vsubps_avx(auVar40,auVar39);
      auVar133 = vsubps_avx(local_1440,local_1200);
      auVar94 = vsubps_avx(local_1500,local_11a0);
      auVar207 = vsubps_avx(auVar146,local_11e0);
      fVar127 = auVar207._0_4_;
      fVar129 = auVar207._4_4_;
      auVar41._4_4_ = fVar129 * fStack_117c;
      auVar41._0_4_ = fVar127 * local_1180;
      fVar130 = auVar207._8_4_;
      auVar41._8_4_ = fVar130 * fStack_1178;
      fVar145 = auVar207._12_4_;
      auVar41._12_4_ = fVar145 * fStack_1174;
      fVar147 = auVar207._16_4_;
      auVar41._16_4_ = fVar147 * fStack_1170;
      fVar148 = auVar207._20_4_;
      auVar41._20_4_ = fVar148 * fStack_116c;
      fVar150 = auVar207._24_4_;
      auVar41._24_4_ = fVar150 * fStack_1168;
      auVar41._28_4_ = fVar37;
      fVar154 = auVar94._0_4_;
      fVar166 = auVar94._4_4_;
      auVar42._4_4_ = fVar166 * local_11c0._4_4_;
      auVar42._0_4_ = fVar154 * (float)local_11c0;
      fVar173 = auVar94._8_4_;
      auVar42._8_4_ = fVar173 * (float)uStack_11b8;
      fVar175 = auVar94._12_4_;
      auVar42._12_4_ = fVar175 * uStack_11b8._4_4_;
      fVar177 = auVar94._16_4_;
      auVar42._16_4_ = fVar177 * (float)uStack_11b0;
      fVar179 = auVar94._20_4_;
      auVar42._20_4_ = fVar179 * uStack_11b0._4_4_;
      fVar181 = auVar94._24_4_;
      auVar42._24_4_ = fVar181 * (float)uStack_11a8;
      auVar42._28_4_ = local_14a0._4_4_;
      auVar208 = vsubps_avx(auVar42,auVar41);
      fVar203 = auVar133._0_4_;
      fVar214 = auVar133._4_4_;
      auVar43._4_4_ = fVar214 * local_11c0._4_4_;
      auVar43._0_4_ = fVar203 * (float)local_11c0;
      fVar215 = auVar133._8_4_;
      auVar43._8_4_ = fVar215 * (float)uStack_11b8;
      fVar216 = auVar133._12_4_;
      auVar43._12_4_ = fVar216 * uStack_11b8._4_4_;
      fVar217 = auVar133._16_4_;
      auVar43._16_4_ = fVar217 * (float)uStack_11b0;
      fVar218 = auVar133._20_4_;
      auVar43._20_4_ = fVar218 * uStack_11b0._4_4_;
      fVar219 = auVar133._24_4_;
      auVar43._24_4_ = fVar219 * (float)uStack_11a8;
      auVar43._28_4_ = fVar37;
      auVar44._4_4_ = fVar129 * (float)local_1400._4_4_;
      auVar44._0_4_ = fVar127 * (float)local_1400._0_4_;
      auVar44._8_4_ = fVar130 * fStack_13f8;
      auVar44._12_4_ = fVar145 * fStack_13f4;
      auVar44._16_4_ = fVar147 * (float)uStack_13f0;
      auVar44._20_4_ = fVar148 * uStack_13f0._4_4_;
      auVar44._24_4_ = fVar150 * fStack_13e8;
      auVar44._28_4_ = auVar207._28_4_;
      auVar25 = vsubps_avx(auVar44,auVar43);
      auVar45._4_4_ = fVar166 * (float)local_1400._4_4_;
      auVar45._0_4_ = fVar154 * (float)local_1400._0_4_;
      auVar45._8_4_ = fVar173 * fStack_13f8;
      auVar45._12_4_ = fVar175 * fStack_13f4;
      auVar45._16_4_ = fVar177 * (float)uStack_13f0;
      auVar45._20_4_ = fVar179 * uStack_13f0._4_4_;
      auVar45._24_4_ = fVar181 * fStack_13e8;
      auVar45._28_4_ = fVar37;
      auVar47._4_4_ = fVar214 * fStack_117c;
      auVar47._0_4_ = fVar203 * local_1180;
      auVar47._8_4_ = fVar215 * fStack_1178;
      auVar47._12_4_ = fVar216 * fStack_1174;
      auVar47._16_4_ = fVar217 * fStack_1170;
      auVar47._20_4_ = fVar218 * fStack_116c;
      fVar46 = auVar25._28_4_;
      auVar47._24_4_ = fVar219 * fStack_1168;
      auVar47._28_4_ = fVar46;
      auVar26 = vsubps_avx(auVar47,auVar45);
      auVar136._0_4_ =
           auVar160._0_4_ * (float)local_1400._0_4_ +
           local_1580._0_4_ * local_1180 + auVar24._0_4_ * (float)local_11c0;
      auVar136._4_4_ =
           auVar160._4_4_ * (float)local_1400._4_4_ +
           local_1580._4_4_ * fStack_117c + auVar24._4_4_ * local_11c0._4_4_;
      auVar136._8_4_ =
           auVar160._8_4_ * fStack_13f8 +
           local_1580._8_4_ * fStack_1178 + auVar24._8_4_ * (float)uStack_11b8;
      auVar136._12_4_ =
           auVar160._12_4_ * fStack_13f4 +
           local_1580._12_4_ * fStack_1174 + auVar24._12_4_ * uStack_11b8._4_4_;
      auVar136._16_4_ =
           auVar160._16_4_ * (float)uStack_13f0 +
           local_1580._16_4_ * fStack_1170 + auVar24._16_4_ * (float)uStack_11b0;
      auVar136._20_4_ =
           auVar160._20_4_ * uStack_13f0._4_4_ +
           local_1580._20_4_ * fStack_116c + auVar24._20_4_ * uStack_11b0._4_4_;
      auVar136._24_4_ =
           auVar160._24_4_ * fStack_13e8 +
           local_1580._24_4_ * fStack_1168 + auVar24._24_4_ * (float)uStack_11a8;
      auVar136._28_4_ = fVar46 + fVar46 + fVar37;
      auVar124._8_4_ = 0x80000000;
      auVar124._0_8_ = 0x8000000080000000;
      auVar124._12_4_ = 0x80000000;
      auVar124._16_4_ = 0x80000000;
      auVar124._20_4_ = 0x80000000;
      auVar124._24_4_ = 0x80000000;
      auVar124._28_4_ = 0x80000000;
      auVar133 = vandps_avx(auVar136,auVar124);
      uVar83 = auVar133._0_4_;
      auVar165._0_4_ =
           (float)(uVar83 ^ (uint)(auVar208._0_4_ * fVar117 +
                                  fVar116 * auVar25._0_4_ + auVar26._0_4_ * fVar121));
      auVar128._28_4_ = auVar133._4_4_;
      auVar165._4_4_ =
           (float)(auVar128._28_4_ ^
                  (uint)(auVar208._4_4_ * fVar120 +
                        fVar119 * auVar25._4_4_ + auVar26._4_4_ * fVar118));
      uVar149 = auVar133._8_4_;
      auVar165._8_4_ =
           (float)(uVar149 ^
                  (uint)(auVar208._8_4_ * fVar115 +
                        fVar140 * auVar25._8_4_ + auVar26._8_4_ * fVar139));
      uVar151 = auVar133._12_4_;
      auVar165._12_4_ =
           (float)(uVar151 ^
                  (uint)(auVar208._12_4_ * fVar12 +
                        fVar11 * auVar25._12_4_ + auVar26._12_4_ * fVar27));
      uVar153 = auVar133._16_4_;
      auVar165._16_4_ =
           (float)(uVar153 ^
                  (uint)(auVar208._16_4_ * fVar15 +
                        fVar14 * auVar25._16_4_ + auVar26._16_4_ * fVar13));
      uVar155 = auVar133._20_4_;
      auVar165._20_4_ =
           (float)(uVar155 ^
                  (uint)(auVar208._20_4_ * fVar18 +
                        fVar17 * auVar25._20_4_ + auVar26._20_4_ * fVar16));
      uVar157 = auVar133._24_4_;
      auVar165._24_4_ =
           (float)(uVar157 ^
                  (uint)(auVar208._24_4_ * fVar21 +
                        fVar20 * auVar25._24_4_ + auVar26._24_4_ * fVar19));
      uVar158 = auVar133._28_4_;
      auVar165._28_4_ = uVar158 ^ (uint)(auVar184._28_4_ + auVar9._28_4_ + -0.0);
      auVar133 = vcmpps_avx(auVar165,_DAT_01faff00,5);
      auVar184 = auVar185 & auVar133;
      if ((((((((auVar184 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar184 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar184 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar184 >> 0x7f,0) != '\0') ||
            (auVar184 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar184 >> 0xbf,0) != '\0') ||
          (auVar184 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar184[0x1f] < '\0') {
        auVar133 = vandps_avx(auVar133,auVar185);
        auVar93 = vpackssdw_avx(auVar133._0_16_,auVar133._16_16_);
        auVar170._0_4_ =
             (float)(uVar83 ^ (uint)(fVar220 * auVar208._0_4_ +
                                    auVar25._0_4_ * fVar152 + fVar188 * auVar26._0_4_));
        auVar170._4_4_ =
             (float)(auVar128._28_4_ ^
                    (uint)(fVar225 * auVar208._4_4_ +
                          auVar25._4_4_ * fVar156 + fVar197 * auVar26._4_4_));
        auVar170._8_4_ =
             (float)(uVar149 ^
                    (uint)(fVar226 * auVar208._8_4_ +
                          auVar25._8_4_ * fVar172 + fVar198 * auVar26._8_4_));
        auVar170._12_4_ =
             (float)(uVar151 ^
                    (uint)(fVar227 * auVar208._12_4_ +
                          auVar25._12_4_ * fVar174 + fVar199 * auVar26._12_4_));
        auVar170._16_4_ =
             (float)(uVar153 ^
                    (uint)(fVar228 * auVar208._16_4_ +
                          auVar25._16_4_ * fVar176 + fVar200 * auVar26._16_4_));
        auVar170._20_4_ =
             (float)(uVar155 ^
                    (uint)(fVar229 * auVar208._20_4_ +
                          auVar25._20_4_ * fVar178 + fVar201 * auVar26._20_4_));
        auVar170._24_4_ =
             (float)(uVar157 ^
                    (uint)(fVar230 * auVar208._24_4_ +
                          auVar25._24_4_ * fVar180 + fVar202 * auVar26._24_4_));
        auVar170._28_4_ = uVar158 ^ (uint)(auVar23._28_4_ + auVar23._28_4_ + 0.0);
        auVar133 = vcmpps_avx(auVar170,_DAT_01faff00,5);
        auVar132 = vpackssdw_avx(auVar133._0_16_,auVar133._16_16_);
        auVar93 = vpand_avx(auVar93,auVar132);
        auVar132 = vpmovsxwd_avx(auVar93);
        auVar189 = vpunpckhwd_avx(auVar93,auVar93);
        auVar98._16_16_ = auVar189;
        auVar98._0_16_ = auVar132;
        if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar98 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar98 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar98 >> 0x7f,0) != '\0') ||
              (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB161(auVar189 >> 0x3f,0) != '\0') ||
            (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar189[0xf] < '\0') {
          auVar99._8_4_ = 0x7fffffff;
          auVar99._0_8_ = 0x7fffffff7fffffff;
          auVar99._12_4_ = 0x7fffffff;
          auVar99._16_4_ = 0x7fffffff;
          auVar99._20_4_ = 0x7fffffff;
          auVar99._24_4_ = 0x7fffffff;
          auVar99._28_4_ = 0x7fffffff;
          auVar133 = vandps_avx(auVar136,auVar99);
          auVar184 = vsubps_avx(auVar133,auVar165);
          auVar184 = vcmpps_avx(auVar184,auVar170,5);
          auVar132 = vpackssdw_avx(auVar184._0_16_,auVar184._16_16_);
          auVar93 = vpand_avx(auVar93,auVar132);
          auVar132 = vpmovsxwd_avx(auVar93);
          auVar189 = vpunpckhwd_avx(auVar93,auVar93);
          auVar100._16_16_ = auVar189;
          auVar100._0_16_ = auVar132;
          if ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar100 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar100 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar100 >> 0x7f,0) != '\0') ||
                (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar189 >> 0x3f,0) != '\0') ||
              (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar189[0xf] < '\0') {
            fStack_1484 = auVar94._28_4_;
            fVar121 = fStack_1484 + fStack_1484 + auVar207._28_4_;
            auVar211._0_4_ =
                 (float)(uVar83 ^ (uint)(auVar160._0_4_ * fVar203 +
                                        fVar154 * local_1580._0_4_ + fVar127 * auVar24._0_4_));
            auVar211._4_4_ =
                 (float)(auVar128._28_4_ ^
                        (uint)(auVar160._4_4_ * fVar214 +
                              fVar166 * local_1580._4_4_ + fVar129 * auVar24._4_4_));
            auVar211._8_4_ =
                 (float)(uVar149 ^
                        (uint)(auVar160._8_4_ * fVar215 +
                              fVar173 * local_1580._8_4_ + fVar130 * auVar24._8_4_));
            auVar211._12_4_ =
                 (float)(uVar151 ^
                        (uint)(auVar160._12_4_ * fVar216 +
                              fVar175 * local_1580._12_4_ + fVar145 * auVar24._12_4_));
            auVar211._16_4_ =
                 (float)(uVar153 ^
                        (uint)(auVar160._16_4_ * fVar217 +
                              fVar177 * local_1580._16_4_ + fVar147 * auVar24._16_4_));
            auVar211._20_4_ =
                 (float)(uVar155 ^
                        (uint)(auVar160._20_4_ * fVar218 +
                              fVar179 * local_1580._20_4_ + fVar148 * auVar24._20_4_));
            auVar211._24_4_ =
                 (float)(uVar157 ^
                        (uint)(auVar160._24_4_ * fVar219 +
                              fVar181 * local_1580._24_4_ + fVar150 * auVar24._24_4_));
            auVar211._28_4_ = uVar158 ^ (uint)fVar121;
            fVar116 = auVar133._0_4_;
            fVar117 = auVar133._4_4_;
            auVar48._4_4_ = fVar117 * *(float *)(ray + 100);
            auVar48._0_4_ = fVar116 * *(float *)(ray + 0x60);
            fVar118 = auVar133._8_4_;
            auVar48._8_4_ = fVar118 * *(float *)(ray + 0x68);
            fVar119 = auVar133._12_4_;
            auVar48._12_4_ = fVar119 * *(float *)(ray + 0x6c);
            fVar120 = auVar133._16_4_;
            auVar48._16_4_ = fVar120 * *(float *)(ray + 0x70);
            fVar139 = auVar133._20_4_;
            auVar48._20_4_ = fVar139 * *(float *)(ray + 0x74);
            fVar140 = auVar133._24_4_;
            auVar48._24_4_ = fVar140 * *(float *)(ray + 0x78);
            auVar48._28_4_ = fVar121;
            auVar184 = vcmpps_avx(auVar48,auVar211,1);
            auVar49._4_4_ = fVar117 * *(float *)(ray + 0x104);
            auVar49._0_4_ = fVar116 * *(float *)(ray + 0x100);
            auVar49._8_4_ = fVar118 * *(float *)(ray + 0x108);
            auVar49._12_4_ = fVar119 * *(float *)(ray + 0x10c);
            auVar49._16_4_ = fVar120 * *(float *)(ray + 0x110);
            auVar49._20_4_ = fVar139 * *(float *)(ray + 0x114);
            auVar49._24_4_ = fVar140 * *(float *)(ray + 0x118);
            auVar49._28_4_ = fStack_1484;
            auVar9 = vcmpps_avx(auVar211,auVar49,2);
            auVar184 = vandps_avx(auVar184,auVar9);
            auVar132 = vpackssdw_avx(auVar184._0_16_,auVar184._16_16_);
            auVar93 = vpand_avx(auVar132,auVar93);
            auVar132 = vpmovsxwd_avx(auVar93);
            auVar189 = vpshufd_avx(auVar93,0xee);
            auVar189 = vpmovsxwd_avx(auVar189);
            auVar101._16_16_ = auVar189;
            auVar101._0_16_ = auVar132;
            if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar101 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar101 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar101 >> 0x7f,0) != '\0') ||
                  (auVar101 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB161(auVar189 >> 0x3f,0) != '\0') ||
                (auVar101 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar189[0xf] < '\0') {
              auVar184 = vcmpps_avx(auVar136,_DAT_01faff00,4);
              auVar132 = vpackssdw_avx(auVar184._0_16_,auVar184._16_16_);
              auVar93 = vpand_avx(auVar93,auVar132);
              auVar132 = vpmovsxwd_avx(auVar93);
              auVar93 = vpunpckhwd_avx(auVar93,auVar93);
              auVar102._16_16_ = auVar93;
              auVar102._0_16_ = auVar132;
              if ((((((((auVar102 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar102 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar102 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar102 >> 0x7f,0) != '\0') ||
                    (auVar102 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB161(auVar93 >> 0x3f,0) != '\0') ||
                  (auVar102 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar93[0xf] < '\0') {
                auVar128._28_4_ = *(uint *)(lVar86 + lVar91 * 4);
                uVar83 = ((context->scene->geometries).items[auVar128._28_4_].ptr)->mask;
                auVar103._4_4_ = uVar83;
                auVar103._0_4_ = uVar83;
                auVar103._8_4_ = uVar83;
                auVar103._12_4_ = uVar83;
                auVar103._16_4_ = uVar83;
                auVar103._20_4_ = uVar83;
                auVar103._24_4_ = uVar83;
                auVar103._28_4_ = uVar83;
                auVar184 = vandps_avx(auVar103,*(undefined1 (*) [32])(ray + 0x120));
                auVar189 = vpcmpeqd_avx(auVar184._16_16_,(undefined1  [16])0x0);
                auVar10 = vpcmpeqd_avx(auVar184._0_16_,(undefined1  [16])0x0);
                auVar125._16_16_ = auVar189;
                auVar125._0_16_ = auVar10;
                auVar184 = vblendps_avx(ZEXT1632(auVar10),auVar125,0xf0);
                auVar143._16_16_ = auVar93;
                auVar143._0_16_ = auVar132;
                auVar9 = auVar143 & ~auVar184;
                if ((((((((auVar9 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar9 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar9 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar9 >> 0x7f,0) != '\0') ||
                      (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar9 >> 0xbf,0) != '\0') ||
                    (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar9[0x1f] < '\0') {
                  auVar94 = vrcpps_avx(auVar133);
                  fVar121 = auVar94._0_4_;
                  fVar115 = auVar94._4_4_;
                  auVar50._4_4_ = fVar117 * fVar115;
                  auVar50._0_4_ = fVar116 * fVar121;
                  fVar116 = auVar94._8_4_;
                  auVar50._8_4_ = fVar118 * fVar116;
                  fVar117 = auVar94._12_4_;
                  auVar50._12_4_ = fVar119 * fVar117;
                  fVar118 = auVar94._16_4_;
                  auVar50._16_4_ = fVar120 * fVar118;
                  fVar119 = auVar94._20_4_;
                  auVar50._20_4_ = fVar139 * fVar119;
                  fVar120 = auVar94._24_4_;
                  auVar50._24_4_ = fVar140 * fVar120;
                  auVar50._28_4_ = auVar189._12_4_;
                  auVar137._8_4_ = 0x3f800000;
                  auVar137._0_8_ = 0x3f8000003f800000;
                  auVar137._12_4_ = 0x3f800000;
                  auVar137._16_4_ = 0x3f800000;
                  auVar137._20_4_ = 0x3f800000;
                  auVar137._24_4_ = 0x3f800000;
                  auVar137._28_4_ = 0x3f800000;
                  auVar207 = vsubps_avx(auVar137,auVar50);
                  fVar121 = fVar121 + fVar121 * auVar207._0_4_;
                  fVar115 = fVar115 + fVar115 * auVar207._4_4_;
                  fVar116 = fVar116 + fVar116 * auVar207._8_4_;
                  fVar117 = fVar117 + fVar117 * auVar207._12_4_;
                  fVar118 = fVar118 + fVar118 * auVar207._16_4_;
                  fVar119 = fVar119 + fVar119 * auVar207._20_4_;
                  fVar120 = fVar120 + fVar120 * auVar207._24_4_;
                  auVar51._4_4_ = auVar170._4_4_ * fVar115;
                  auVar51._0_4_ = auVar170._0_4_ * fVar121;
                  auVar51._8_4_ = auVar170._8_4_ * fVar116;
                  auVar51._12_4_ = auVar170._12_4_ * fVar117;
                  auVar51._16_4_ = auVar170._16_4_ * fVar118;
                  auVar51._20_4_ = auVar170._20_4_ * fVar119;
                  auVar51._24_4_ = auVar170._24_4_ * fVar120;
                  auVar51._28_4_ = auVar207._28_4_;
                  auVar133 = vminps_avx(auVar51,auVar137);
                  auVar23 = vsubps_avx(auVar137,auVar133);
                  auVar62._8_8_ = uVar77;
                  auVar62._0_8_ = uVar76;
                  auVar62._16_8_ = uVar76;
                  auVar62._24_8_ = uVar77;
                  auVar9 = vblendvps_avx(auVar133,auVar23,auVar62);
                  auVar52._4_4_ = fVar115 * auVar165._4_4_;
                  auVar52._0_4_ = fVar121 * auVar165._0_4_;
                  auVar52._8_4_ = fVar116 * auVar165._8_4_;
                  auVar52._12_4_ = fVar117 * auVar165._12_4_;
                  auVar52._16_4_ = fVar118 * auVar165._16_4_;
                  auVar52._20_4_ = fVar119 * auVar165._20_4_;
                  auVar52._24_4_ = fVar120 * auVar165._24_4_;
                  auVar52._28_4_ = auVar23._28_4_;
                  auVar133 = vminps_avx(auVar52,auVar137);
                  auVar23 = vsubps_avx(auVar137,auVar133);
                  auVar23 = vblendvps_avx(auVar133,auVar23,auVar62);
                  auVar184 = vandnps_avx(auVar184,auVar143);
                  auVar53._4_4_ = auVar211._4_4_ * fVar115;
                  auVar53._0_4_ = auVar211._0_4_ * fVar121;
                  auVar53._8_4_ = auVar211._8_4_ * fVar116;
                  auVar53._12_4_ = auVar211._12_4_ * fVar117;
                  auVar53._16_4_ = auVar211._16_4_ * fVar118;
                  auVar53._20_4_ = auVar211._20_4_ * fVar119;
                  auVar53._24_4_ = auVar211._24_4_ * fVar120;
                  auVar53._28_4_ = auVar94._28_4_ + auVar207._28_4_;
                  uVar6 = *(undefined4 *)((long)&local_15c0 + lVar91 * 4);
                  auVar144._4_4_ = uVar6;
                  auVar144._0_4_ = uVar6;
                  auVar144._8_4_ = uVar6;
                  auVar144._12_4_ = uVar6;
                  auVar144._16_4_ = uVar6;
                  auVar144._20_4_ = uVar6;
                  auVar144._24_4_ = uVar6;
                  auVar144._28_4_ = uVar6;
                  auVar133 = vmaskmovps_avx(auVar184,auVar53);
                  *(undefined1 (*) [32])pRVar1 = auVar133;
                  auVar133 = vmaskmovps_avx(auVar184,auVar160);
                  *(undefined1 (*) [32])(ray + 0x180) = auVar133;
                  auVar133 = vmaskmovps_avx(auVar184,_local_1580);
                  *(undefined1 (*) [32])(ray + 0x1a0) = auVar133;
                  auVar133 = vmaskmovps_avx(auVar184,auVar24);
                  *(undefined1 (*) [32])(ray + 0x1c0) = auVar133;
                  auVar133 = vmaskmovps_avx(auVar184,auVar23);
                  *(undefined1 (*) [32])(ray + 0x1e0) = auVar133;
                  auVar133 = vmaskmovps_avx(auVar184,auVar9);
                  *(undefined1 (*) [32])(ray + 0x200) = auVar133;
                  auVar133 = vmaskmovps_avx(auVar184,auVar144);
                  *(undefined1 (*) [32])(ray + 0x220) = auVar133;
                  auVar93 = vpshufd_avx(ZEXT416(auVar128._28_4_),0);
                  auVar104._16_16_ = auVar93;
                  auVar104._0_16_ = auVar93;
                  auVar133 = vmaskmovps_avx(auVar184,auVar104);
                  *(undefined1 (*) [32])(ray + 0x240) = auVar133;
                  uVar83 = context->user->instID[0];
                  auVar105._4_4_ = uVar83;
                  auVar105._0_4_ = uVar83;
                  auVar105._8_4_ = uVar83;
                  auVar105._12_4_ = uVar83;
                  auVar105._16_4_ = uVar83;
                  auVar105._20_4_ = uVar83;
                  auVar105._24_4_ = uVar83;
                  auVar105._28_4_ = uVar83;
                  auVar133 = vmaskmovps_avx(auVar184,auVar105);
                  *(undefined1 (*) [32])(ray + 0x260) = auVar133;
                  uVar83 = context->user->instPrimID[0];
                  auVar106._4_4_ = uVar83;
                  auVar106._0_4_ = uVar83;
                  auVar106._8_4_ = uVar83;
                  auVar106._12_4_ = uVar83;
                  auVar106._16_4_ = uVar83;
                  auVar106._20_4_ = uVar83;
                  auVar106._24_4_ = uVar83;
                  auVar106._28_4_ = uVar83;
                  auVar133 = vmaskmovps_avx(auVar184,auVar106);
                  *(undefined1 (*) [32])(ray + 0x280) = auVar133;
                }
              }
            }
          }
        }
      }
      lVar91 = lVar91 + 1;
      _local_15a0 = auVar95;
    } while (lVar91 != 4);
    lVar81 = lVar81 + 1;
    lVar86 = lVar86 + 0xe0;
  } while (lVar81 != uVar79 - 8);
LAB_0039747d:
  auVar133 = vcmpps_avx(*(undefined1 (*) [32])pRVar1,auVar8,1);
  auVar133 = auVar185 & auVar133;
  auStack_14d0 = auVar185._16_16_;
  if ((((((((auVar133 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar133 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar133 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar133 >> 0x7f,0) != '\0') ||
        (auVar133 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar133 >> 0xbf,0) != '\0') ||
      (auVar133 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar133[0x1f] < '\0')
  {
    auVar8 = vblendvps_avx(auVar8,*(undefined1 (*) [32])pRVar1,auVar185);
    auVar133 = vshufps_avx(auVar8,auVar8,0xb1);
    auVar133 = vmaxps_avx(auVar8,auVar133);
    auVar95 = vshufpd_avx(auVar133,auVar133,5);
    auVar133 = vmaxps_avx(auVar133,auVar95);
    local_1510 = vmaxss_avx(auVar133._0_16_,auVar133._16_16_);
  }
LAB_003974c6:
  _local_1580 = vshufps_avx(local_1510,local_1510,0);
  local_14e0 = auVar8._16_16_;
  _local_15a0 = auVar8._0_16_;
  if (puVar78 == &local_fa0) goto LAB_00397512;
  goto LAB_00396560;
LAB_00397512:
  uVar82 = uVar82 & ~(ulong)(byte)(SUB161(auVar22 >> 7,0) & 1 | (SUB161(auVar22 >> 0xf,0) & 1) << 1
                                   | (SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                                   (SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                                   (SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                                   (SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                                   (SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                                  SUB161(auVar22 >> 0x3f,0) << 7);
  if (uVar82 == 0) {
    return;
  }
  goto LAB_00396095;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersectCoherent(vint<K>* __restrict__ valid_i,
                                                                                                       Accel::Intersectors* __restrict__ This,
                                                                                                       RayHitK<K>& __restrict__ ray,
                                                                                                       RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vbool<K> octant_valid = octant[valid_index] == octant;
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        Frustum<robust> frustum;
        frustum.template init<K>(octant_valid, tray.org, tray.rdir, tray.tnear, tray.tfar, N);

        StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;

        while (1) pop:
        {
          /* pop next node from stack */
          if (unlikely(stackPtr == stack)) break;

          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *(float*)&stackPtr->dist;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active))) continue;

          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            //STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const AABBNode* __restrict__ const node = nodeRef.getAABBNode();

            vfloat<N> fmin;
            size_t m_frustum_node = intersectNodeFrustum<N>(node, frustum, fmin);

            if (unlikely(!m_frustum_node)) goto pop;
            cur = BVH::emptyNode;
            curDist = pos_inf;
            
#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[popcnt(m_frustum_node)], 1, 1, 1);
#endif
            size_t num_child_hits = 0;
            do {
              const size_t i = bscf(m_frustum_node);
              vfloat<K> lnearP;
              vbool<K> lhit = false; // motion blur is not supported, so the initial value will be ignored
              STAT3(normal.trav_nodes, 1, 1, 1);
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              if (likely(any(lhit)))
              {                                
                const vfloat<K> childDist = fmin[i];
                const NodeRef child = node->child(i);
                BVHN<N>::prefetch(child);
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    stackPtr->ptr = cur;
                    *(float*)&stackPtr->dist = toScalar(curDist);
                    stackPtr++;
                  }
                  curDist = childDist;
                  cur = child;
                }
                /* push hit child onto stack */
                else {
                  num_child_hits++;
                  stackPtr->ptr = child;
                  *(float*)&stackPtr->dist = toScalar(childDist);
                  stackPtr++;
                }                
              }
            } while(m_frustum_node);

            if (unlikely(cur == BVH::emptyNode)) goto pop;

            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (stackPtr[-2].dist < stackPtr[-1].dist)
                std::swap(stackPtr[-2],stackPtr[-1]);
              if (unlikely(num_child_hits >= 3))
              {
                if (stackPtr[-3].dist < stackPtr[-1].dist)
                  std::swap(stackPtr[-3],stackPtr[-1]);
                if (stackPtr[-3].dist < stackPtr[-2].dist)
                  std::swap(stackPtr[-3],stackPtr[-2]);
              }
            }
          }

          /* intersect leaf */
          assert(cur != BVH::invalidNode);
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);

          /* reduce max distance interval on successful intersection */
          if (likely(any((ray.tfar < tray.tfar) & valid_leaf)))
          {
            tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);
            frustum.template updateMaxDist<K>(tray.tfar);
          }

          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        
      } while(valid_bits);
    }